

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [12];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  long lVar72;
  byte bVar73;
  uint uVar74;
  ulong uVar75;
  long lVar76;
  float fVar77;
  undefined4 uVar78;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 extraout_var [56];
  float fVar118;
  float fVar133;
  float fVar134;
  vint4 bi;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar135;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar154;
  float fVar155;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar156;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 ai_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar194;
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar195;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  float fVar196;
  float fVar197;
  undefined8 uVar198;
  float fVar217;
  vint4 ai;
  float fVar215;
  float fVar218;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar208 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar216;
  undefined1 auVar214 [32];
  float fVar222;
  float fVar239;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar248 [16];
  undefined1 auVar259 [32];
  float fVar260;
  float fVar271;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  float fVar272;
  float fVar284;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar315 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar326;
  float fVar336;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_668 [8];
  float fStack_660;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined1 local_5e8 [8];
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  float local_5c8;
  float fStack_5c4;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  Primitive *local_430;
  RTCFilterFunctionNArguments local_428;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  uint auStack_388 [4];
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar71;
  undefined1 auVar117 [64];
  undefined1 auVar151 [32];
  
  PVar6 = prim[1];
  uVar70 = (ulong)(byte)PVar6;
  lVar72 = uVar70 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar77 = *(float *)(prim + lVar72 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar79._0_4_ = fVar77 * auVar15._0_4_;
  auVar79._4_4_ = fVar77 * auVar15._4_4_;
  auVar79._8_4_ = fVar77 * auVar15._8_4_;
  auVar79._12_4_ = fVar77 * auVar15._12_4_;
  auVar101._0_4_ = fVar77 * auVar16._0_4_;
  auVar101._4_4_ = fVar77 * auVar16._4_4_;
  auVar101._8_4_ = fVar77 * auVar16._8_4_;
  auVar101._12_4_ = fVar77 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar70 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar327._4_4_ = auVar101._0_4_;
  auVar327._0_4_ = auVar101._0_4_;
  auVar327._8_4_ = auVar101._0_4_;
  auVar327._12_4_ = auVar101._0_4_;
  auVar23 = vshufps_avx(auVar101,auVar101,0x55);
  auVar24 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar77 = auVar24._0_4_;
  auVar273._0_4_ = fVar77 * auVar17._0_4_;
  fVar178 = auVar24._4_4_;
  auVar273._4_4_ = fVar178 * auVar17._4_4_;
  fVar194 = auVar24._8_4_;
  auVar273._8_4_ = fVar194 * auVar17._8_4_;
  fVar138 = auVar24._12_4_;
  auVar273._12_4_ = fVar138 * auVar17._12_4_;
  auVar261._0_4_ = auVar20._0_4_ * fVar77;
  auVar261._4_4_ = auVar20._4_4_ * fVar178;
  auVar261._8_4_ = auVar20._8_4_ * fVar194;
  auVar261._12_4_ = auVar20._12_4_ * fVar138;
  auVar240._0_4_ = auVar22._0_4_ * fVar77;
  auVar240._4_4_ = auVar22._4_4_ * fVar178;
  auVar240._8_4_ = auVar22._8_4_ * fVar194;
  auVar240._12_4_ = auVar22._12_4_ * fVar138;
  auVar24 = vfmadd231ps_fma(auVar273,auVar23,auVar16);
  auVar246 = vfmadd231ps_fma(auVar261,auVar23,auVar19);
  auVar23 = vfmadd231ps_fma(auVar240,auVar158,auVar23);
  auVar81 = vfmadd231ps_fma(auVar24,auVar327,auVar15);
  auVar246 = vfmadd231ps_fma(auVar246,auVar327,auVar18);
  auVar82 = vfmadd231ps_fma(auVar23,auVar21,auVar327);
  auVar328._4_4_ = auVar79._0_4_;
  auVar328._0_4_ = auVar79._0_4_;
  auVar328._8_4_ = auVar79._0_4_;
  auVar328._12_4_ = auVar79._0_4_;
  auVar23 = vshufps_avx(auVar79,auVar79,0x55);
  auVar24 = vshufps_avx(auVar79,auVar79,0xaa);
  fVar77 = auVar24._0_4_;
  auVar119._0_4_ = fVar77 * auVar17._0_4_;
  fVar178 = auVar24._4_4_;
  auVar119._4_4_ = fVar178 * auVar17._4_4_;
  fVar194 = auVar24._8_4_;
  auVar119._8_4_ = fVar194 * auVar17._8_4_;
  fVar138 = auVar24._12_4_;
  auVar119._12_4_ = fVar138 * auVar17._12_4_;
  auVar93._0_4_ = auVar20._0_4_ * fVar77;
  auVar93._4_4_ = auVar20._4_4_ * fVar178;
  auVar93._8_4_ = auVar20._8_4_ * fVar194;
  auVar93._12_4_ = auVar20._12_4_ * fVar138;
  auVar80._0_4_ = auVar22._0_4_ * fVar77;
  auVar80._4_4_ = auVar22._4_4_ * fVar178;
  auVar80._8_4_ = auVar22._8_4_ * fVar194;
  auVar80._12_4_ = auVar22._12_4_ * fVar138;
  auVar16 = vfmadd231ps_fma(auVar119,auVar23,auVar16);
  auVar17 = vfmadd231ps_fma(auVar93,auVar23,auVar19);
  auVar19 = vfmadd231ps_fma(auVar80,auVar23,auVar158);
  auVar93 = vfmadd231ps_fma(auVar16,auVar328,auVar15);
  auVar94 = vfmadd231ps_fma(auVar17,auVar328,auVar18);
  auVar337._8_4_ = 0x7fffffff;
  auVar337._0_8_ = 0x7fffffff7fffffff;
  auVar337._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar81,auVar337);
  auVar223._8_4_ = 0x219392ef;
  auVar223._0_8_ = 0x219392ef219392ef;
  auVar223._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar223,1);
  auVar16 = vblendvps_avx(auVar81,auVar223,auVar15);
  auVar15 = vandps_avx(auVar246,auVar337);
  auVar15 = vcmpps_avx(auVar15,auVar223,1);
  auVar17 = vblendvps_avx(auVar246,auVar223,auVar15);
  auVar15 = vandps_avx(auVar82,auVar337);
  auVar15 = vcmpps_avx(auVar15,auVar223,1);
  auVar15 = vblendvps_avx(auVar82,auVar223,auVar15);
  auVar95 = vfmadd231ps_fma(auVar19,auVar328,auVar21);
  auVar18 = vrcpps_avx(auVar16);
  auVar224._8_4_ = 0x3f800000;
  auVar224._0_8_ = &DAT_3f8000003f800000;
  auVar224._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar18,auVar224);
  auVar81 = vfmadd132ps_fma(auVar16,auVar18,auVar18);
  auVar16 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar16,auVar224);
  auVar82 = vfmadd132ps_fma(auVar17,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar224);
  auVar79 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  fVar77 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar72 + 0x16)) *
           *(float *)(prim + lVar72 + 0x1a);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar168._4_4_ = fVar77;
  auVar168._0_4_ = fVar77;
  auVar168._8_4_ = fVar77;
  auVar168._12_4_ = fVar77;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar80 = vfmadd213ps_fma(auVar16,auVar168,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar17 = vfmadd213ps_fma(auVar16,auVar168,auVar15);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  uVar75 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 2 + uVar75 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar18 = vfmadd213ps_fma(auVar16,auVar168,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar158);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar19 = vfmadd213ps_fma(auVar16,auVar168,auVar15);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar15 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar70 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar23);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar20 = vfmadd213ps_fma(auVar16,auVar168,auVar15);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar70) + 6);
  auVar15 = vpmovsxwd_avx(auVar24);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar246);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar16 = vfmadd213ps_fma(auVar16,auVar168,auVar15);
  auVar15 = vsubps_avx(auVar80,auVar93);
  auVar189._0_4_ = auVar81._0_4_ * auVar15._0_4_;
  auVar189._4_4_ = auVar81._4_4_ * auVar15._4_4_;
  auVar189._8_4_ = auVar81._8_4_ * auVar15._8_4_;
  auVar189._12_4_ = auVar81._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar93);
  auVar251._0_4_ = auVar81._0_4_ * auVar15._0_4_;
  auVar251._4_4_ = auVar81._4_4_ * auVar15._4_4_;
  auVar251._8_4_ = auVar81._8_4_ * auVar15._8_4_;
  auVar251._12_4_ = auVar81._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar18,auVar94);
  auVar179._0_4_ = auVar82._0_4_ * auVar15._0_4_;
  auVar179._4_4_ = auVar82._4_4_ * auVar15._4_4_;
  auVar179._8_4_ = auVar82._8_4_ * auVar15._8_4_;
  auVar179._12_4_ = auVar82._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar19,auVar94);
  auVar94._0_4_ = auVar82._0_4_ * auVar15._0_4_;
  auVar94._4_4_ = auVar82._4_4_ * auVar15._4_4_;
  auVar94._8_4_ = auVar82._8_4_ * auVar15._8_4_;
  auVar94._12_4_ = auVar82._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar20,auVar95);
  auVar157._0_4_ = auVar79._0_4_ * auVar15._0_4_;
  auVar157._4_4_ = auVar79._4_4_ * auVar15._4_4_;
  auVar157._8_4_ = auVar79._8_4_ * auVar15._8_4_;
  auVar157._12_4_ = auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar16,auVar95);
  auVar81._0_4_ = auVar79._0_4_ * auVar15._0_4_;
  auVar81._4_4_ = auVar79._4_4_ * auVar15._4_4_;
  auVar81._8_4_ = auVar79._8_4_ * auVar15._8_4_;
  auVar81._12_4_ = auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar189,auVar251);
  auVar16 = vpminsd_avx(auVar179,auVar94);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar157,auVar81);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar241._4_4_ = uVar78;
  auVar241._0_4_ = uVar78;
  auVar241._8_4_ = uVar78;
  auVar241._12_4_ = uVar78;
  auVar16 = vmaxps_avx(auVar16,auVar241);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_358._0_4_ = auVar15._0_4_ * 0.99999964;
  local_358._4_4_ = auVar15._4_4_ * 0.99999964;
  local_358._8_4_ = auVar15._8_4_ * 0.99999964;
  local_358._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar189,auVar251);
  auVar16 = vpmaxsd_avx(auVar179,auVar94);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar157,auVar81);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar78;
  auVar120._0_4_ = uVar78;
  auVar120._8_4_ = uVar78;
  auVar120._12_4_ = uVar78;
  auVar16 = vminps_avx(auVar16,auVar120);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar82._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar95._1_3_ = 0;
  auVar95[0] = PVar6;
  auVar95[4] = PVar6;
  auVar95._5_3_ = 0;
  auVar95[8] = PVar6;
  auVar95._9_3_ = 0;
  auVar95[0xc] = PVar6;
  auVar95._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar95,_DAT_01ff0cf0);
  auVar15 = vcmpps_avx(local_358,auVar82,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar66 = vmovmskps_avx(auVar15);
  if (uVar66 == 0) {
    return;
  }
  uVar66 = uVar66 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_430 = prim;
LAB_0178c938:
  lVar72 = 0;
  for (uVar70 = (ulong)uVar66; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar72 = lVar72 + 1;
  }
  uVar69 = *(uint *)(local_430 + 2);
  uVar7 = *(uint *)(local_430 + lVar72 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar69].ptr;
  fVar77 = (pGVar8->time_range).lower;
  fVar194 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar77) / ((pGVar8->time_range).upper - fVar77));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar23 = vmaxss_avx(ZEXT816(0),auVar15);
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar23._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar76);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar76);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar70);
  lVar72 = uVar70 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar72);
  lVar1 = uVar70 + 2;
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar70 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar64 = *pauVar3;
  fVar77 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar76);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar76);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar70);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar72);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar178 = *pfVar4;
  fVar138 = pfVar4[1];
  fVar195 = pfVar4[2];
  fVar137 = pfVar4[3];
  auVar101 = ZEXT816(0) << 0x40;
  auVar300._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar300._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar300._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar300._12_4_ = fVar77 * 0.0;
  auVar242._8_4_ = 0x3e2aaaab;
  auVar242._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar242._12_4_ = 0x3e2aaaab;
  auVar81 = vfmadd213ps_fma(auVar242,auVar17,auVar300);
  auVar311._8_4_ = 0x3f000000;
  auVar311._0_8_ = 0x3f0000003f000000;
  auVar311._12_4_ = 0x3f000000;
  auVar21 = vfmadd231ps_fma(auVar300,auVar17,auVar311);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar16,auVar101);
  auVar251 = vfnmadd231ps_fma(auVar21,auVar15,auVar311);
  auVar180._0_4_ = fVar178 * 0.0;
  auVar180._4_4_ = fVar138 * 0.0;
  auVar180._8_4_ = fVar195 * 0.0;
  auVar180._12_4_ = fVar137 * 0.0;
  auVar21 = vfmadd213ps_fma(auVar242,auVar20,auVar180);
  auVar139._8_4_ = 0x3f2aaaab;
  auVar139._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar139._12_4_ = 0x3f2aaaab;
  auVar21 = vfmadd231ps_fma(auVar21,auVar19,auVar139);
  auVar21 = vfmadd231ps_fma(auVar21,auVar18,auVar242);
  auVar158 = vfmadd231ps_fma(auVar180,auVar20,auVar311);
  auVar158 = vfnmadd231ps_fma(auVar158,auVar19,auVar101);
  auVar22 = vfnmadd231ps_fma(auVar158,auVar18,auVar311);
  auVar329._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar329._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar329._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar329._12_4_ = fVar77 * 0.5;
  auVar158 = vfmadd231ps_fma(auVar329,auVar101,auVar17);
  auVar158 = vfnmadd231ps_fma(auVar158,auVar311,auVar16);
  auVar120 = vfnmadd231ps_fma(auVar158,auVar101,auVar15);
  auVar262._0_4_ = fVar178 * 0.16666667;
  auVar262._4_4_ = fVar138 * 0.16666667;
  auVar262._8_4_ = fVar195 * 0.16666667;
  auVar262._12_4_ = fVar137 * 0.16666667;
  auVar158 = vfmadd231ps_fma(auVar262,auVar20,auVar139);
  auVar158 = vfmadd231ps_fma(auVar158,auVar19,auVar242);
  auVar158 = vfmadd231ps_fma(auVar158,auVar18,auVar101);
  auVar225._0_4_ = fVar178 * 0.5;
  auVar225._4_4_ = fVar138 * 0.5;
  auVar225._8_4_ = fVar195 * 0.5;
  auVar225._12_4_ = fVar137 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar225,auVar101,auVar20);
  auVar19 = vfnmadd231ps_fma(auVar20,auVar311,auVar19);
  auVar20 = vfnmadd231ps_fma(auVar19,auVar101,auVar18);
  auVar18 = vshufps_avx(auVar251,auVar251,0xc9);
  auVar19 = vshufps_avx(auVar21,auVar21,0xc9);
  fVar287 = auVar251._0_4_;
  auVar96._0_4_ = fVar287 * auVar19._0_4_;
  fVar221 = auVar251._4_4_;
  auVar96._4_4_ = fVar221 * auVar19._4_4_;
  fVar222 = auVar251._8_4_;
  auVar96._8_4_ = fVar222 * auVar19._8_4_;
  fVar239 = auVar251._12_4_;
  auVar96._12_4_ = fVar239 * auVar19._12_4_;
  auVar79 = vfmsub231ps_fma(auVar96,auVar18,auVar21);
  auVar19 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar97._0_4_ = fVar287 * auVar19._0_4_;
  auVar97._4_4_ = fVar221 * auVar19._4_4_;
  auVar97._8_4_ = fVar222 * auVar19._8_4_;
  auVar97._12_4_ = fVar239 * auVar19._12_4_;
  auVar80 = vfmsub231ps_fma(auVar97,auVar18,auVar22);
  auVar18 = vshufps_avx(auVar120,auVar120,0xc9);
  auVar19 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar260 = auVar120._0_4_;
  auVar98._0_4_ = fVar260 * auVar19._0_4_;
  fVar271 = auVar120._4_4_;
  auVar98._4_4_ = fVar271 * auVar19._4_4_;
  fVar326 = auVar120._8_4_;
  auVar98._8_4_ = fVar326 * auVar19._8_4_;
  fVar336 = auVar120._12_4_;
  auVar98._12_4_ = fVar336 * auVar19._12_4_;
  auVar93 = vfmsub231ps_fma(auVar98,auVar18,auVar158);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar99._0_4_ = fVar260 * auVar19._0_4_;
  auVar99._4_4_ = fVar271 * auVar19._4_4_;
  auVar99._8_4_ = fVar326 * auVar19._8_4_;
  auVar99._12_4_ = fVar336 * auVar19._12_4_;
  auVar94 = vfmsub231ps_fma(auVar99,auVar18,auVar20);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar76);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar76);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar65 = *pauVar3;
  fVar137 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar76);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar76);
  auVar263._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar263._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar263._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar263._12_4_ = fVar137 * 0.0;
  auVar82 = vfmadd213ps_fma(auVar242,auVar18,auVar263);
  auVar20 = vfmadd231ps_fma(auVar263,auVar18,auVar311);
  auVar19 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar72);
  auVar21 = vfnmadd231ps_fma(auVar20,auVar19,auVar101);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar70);
  auVar157 = vfnmadd231ps_fma(auVar21,auVar20,auVar311);
  auVar21 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar178 = *pfVar4;
  fVar138 = pfVar4[1];
  fVar195 = pfVar4[2];
  fVar118 = pfVar4[3];
  auVar83._0_4_ = fVar178 * 0.0;
  auVar83._4_4_ = fVar138 * 0.0;
  auVar83._8_4_ = fVar195 * 0.0;
  auVar83._12_4_ = fVar118 * 0.0;
  auVar22 = vfmadd213ps_fma(auVar242,auVar21,auVar83);
  auVar158 = *(undefined1 (*) [16])(lVar13 + lVar72 * lVar10);
  auVar100._8_4_ = 0x3f2aaaab;
  auVar100._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar100._12_4_ = 0x3f2aaaab;
  auVar24 = vfmadd231ps_fma(auVar22,auVar158,auVar100);
  auVar22 = *(undefined1 (*) [16])(lVar13 + uVar70 * lVar10);
  auVar246 = vfmadd231ps_fma(auVar24,auVar22,auVar242);
  auVar24 = vshufps_avx(auVar246,auVar246,0xc9);
  fVar285 = auVar157._0_4_;
  auVar181._0_4_ = fVar285 * auVar24._0_4_;
  fVar219 = auVar157._4_4_;
  auVar181._4_4_ = fVar219 * auVar24._4_4_;
  fVar286 = auVar157._8_4_;
  auVar181._8_4_ = fVar286 * auVar24._8_4_;
  fVar220 = auVar157._12_4_;
  auVar181._12_4_ = fVar220 * auVar24._12_4_;
  auVar24 = vshufps_avx(auVar157,auVar157,0xc9);
  auVar95 = vfmsub231ps_fma(auVar181,auVar24,auVar246);
  auVar246 = vfmadd231ps_fma(auVar83,auVar21,auVar311);
  auVar246 = vfnmadd231ps_fma(auVar246,auVar158,auVar101);
  auVar101 = vfnmadd231ps_fma(auVar246,auVar22,auVar311);
  auVar246 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar182._0_4_ = fVar285 * auVar246._0_4_;
  auVar182._4_4_ = fVar219 * auVar246._4_4_;
  auVar182._8_4_ = fVar286 * auVar246._8_4_;
  auVar182._12_4_ = fVar220 * auVar246._12_4_;
  auVar246 = vfmsub231ps_fma(auVar182,auVar24,auVar101);
  auVar338._8_4_ = 0x3e2aaaab;
  auVar338._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar338._12_4_ = 0x3e2aaaab;
  auVar84._0_4_ = fVar178 * 0.16666667;
  auVar84._4_4_ = fVar138 * 0.16666667;
  auVar84._8_4_ = fVar195 * 0.16666667;
  auVar84._12_4_ = fVar118 * 0.16666667;
  auVar288._8_4_ = 0x3f2aaaab;
  auVar288._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar288._12_4_ = 0x3f2aaaab;
  auVar24 = vfmadd231ps_fma(auVar84,auVar21,auVar288);
  auVar140._0_4_ = fVar178 * 0.5;
  auVar140._4_4_ = fVar138 * 0.5;
  auVar140._8_4_ = fVar195 * 0.5;
  auVar140._12_4_ = fVar118 * 0.5;
  auVar101 = ZEXT816(0) << 0x20;
  auVar21 = vfmadd231ps_fma(auVar140,auVar101,auVar21);
  auVar24 = vfmadd231ps_fma(auVar24,auVar158,auVar338);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar311,auVar158);
  auVar158 = vfmadd231ps_fma(auVar24,auVar22,auVar101);
  auVar22 = vfnmadd231ps_fma(auVar21,auVar101,auVar22);
  local_668._0_4_ = auVar65._0_4_;
  local_668._4_4_ = auVar65._4_4_;
  fStack_660 = auVar65._8_4_;
  auVar183._0_4_ = (float)local_668._0_4_ * 0.5;
  auVar183._4_4_ = (float)local_668._4_4_ * 0.5;
  auVar183._8_4_ = fStack_660 * 0.5;
  auVar183._12_4_ = fVar137 * 0.5;
  auVar21 = vfmadd231ps_fma(auVar183,auVar101,auVar18);
  auVar21 = vfnmadd231ps_fma(auVar21,auVar311,auVar19);
  auVar179 = vfnmadd231ps_fma(auVar21,auVar101,auVar20);
  auVar21 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar272 = auVar179._0_4_;
  auVar102._0_4_ = fVar272 * auVar21._0_4_;
  fVar197 = auVar179._4_4_;
  auVar102._4_4_ = fVar197 * auVar21._4_4_;
  fVar284 = auVar179._8_4_;
  auVar102._8_4_ = fVar284 * auVar21._8_4_;
  fVar216 = auVar179._12_4_;
  auVar102._12_4_ = fVar216 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar101 = vfmsub231ps_fma(auVar102,auVar21,auVar158);
  auVar158 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar85._0_4_ = fVar272 * auVar158._0_4_;
  auVar85._4_4_ = fVar197 * auVar158._4_4_;
  auVar85._8_4_ = fVar284 * auVar158._8_4_;
  auVar85._12_4_ = fVar216 * auVar158._12_4_;
  auVar119 = vfmsub231ps_fma(auVar85,auVar21,auVar22);
  fVar194 = fVar194 - auVar23._0_4_;
  local_618._0_4_ = auVar64._0_4_;
  local_618._4_4_ = auVar64._4_4_;
  fStack_610 = auVar64._8_4_;
  auVar103._0_4_ = (float)local_618._0_4_ * 0.16666667;
  auVar103._4_4_ = (float)local_618._4_4_ * 0.16666667;
  auVar103._8_4_ = fStack_610 * 0.16666667;
  auVar103._12_4_ = fVar77 * 0.16666667;
  auVar17 = vfmadd231ps_fma(auVar103,auVar288,auVar17);
  auVar21 = vfmadd231ps_fma(auVar81,auVar16,auVar288);
  auVar158 = vfmadd231ps_fma(auVar17,auVar16,auVar338);
  auVar23 = vfmadd231ps_fma(auVar21,auVar15,auVar338);
  auVar17 = vpermilps_avx(auVar79,0xc9);
  auVar16 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar24 = vfmadd231ps_fma(auVar158,auVar15,ZEXT816(0));
  fVar178 = auVar16._0_4_;
  auVar158 = ZEXT416((uint)fVar178);
  auVar15 = vrsqrtss_avx(auVar158,auVar158);
  fVar77 = auVar15._0_4_;
  fVar77 = fVar178 * -0.5 * fVar77 * fVar77 * fVar77 + fVar77 * 1.5;
  auVar15 = vpermilps_avx(auVar80,0xc9);
  auVar339._0_4_ = fVar178 * auVar15._0_4_;
  auVar339._4_4_ = fVar178 * auVar15._4_4_;
  auVar339._8_4_ = fVar178 * auVar15._8_4_;
  auVar339._12_4_ = fVar178 * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar17,auVar15,0x7f);
  fVar178 = auVar15._0_4_;
  auVar243._0_4_ = fVar178 * auVar17._0_4_;
  auVar243._4_4_ = fVar178 * auVar17._4_4_;
  auVar243._8_4_ = fVar178 * auVar17._8_4_;
  auVar243._12_4_ = fVar178 * auVar17._12_4_;
  auVar21 = vsubps_avx(auVar339,auVar243);
  auVar15 = vrcpss_avx(auVar158,auVar158);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar138 = auVar15._0_4_ * auVar16._0_4_;
  fVar118 = auVar17._0_4_ * fVar77;
  fVar133 = auVar17._4_4_ * fVar77;
  fVar134 = auVar17._8_4_ * fVar77;
  fVar135 = auVar17._12_4_ * fVar77;
  auVar158 = vpermilps_avx(auVar93,0xc9);
  auVar16 = vdpps_avx(auVar158,auVar158,0x7f);
  auVar15 = vblendps_avx(auVar16,_DAT_01feba10,0xe);
  auVar17 = vrsqrtss_avx(auVar15,auVar15);
  fVar195 = auVar16._0_4_;
  fVar178 = auVar17._0_4_;
  auVar22 = vpermilps_avx(auVar94,0xc9);
  auVar17 = vdpps_avx(auVar158,auVar22,0x7f);
  fVar178 = fVar178 * 1.5 + fVar178 * fVar178 * fVar178 * fVar195 * -0.5;
  auVar289._0_4_ = fVar195 * auVar22._0_4_;
  auVar289._4_4_ = fVar195 * auVar22._4_4_;
  auVar289._8_4_ = fVar195 * auVar22._8_4_;
  auVar289._12_4_ = fVar195 * auVar22._12_4_;
  fVar195 = auVar17._0_4_;
  auVar86._0_4_ = fVar195 * auVar158._0_4_;
  auVar86._4_4_ = fVar195 * auVar158._4_4_;
  auVar86._8_4_ = fVar195 * auVar158._8_4_;
  auVar86._12_4_ = fVar195 * auVar158._12_4_;
  auVar17 = vsubps_avx(auVar289,auVar86);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar81 = SUB6416(ZEXT464(0x40000000),0);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,auVar81);
  fVar195 = auVar15._0_4_ * auVar16._0_4_;
  fVar136 = auVar158._0_4_ * fVar178;
  fVar154 = auVar158._4_4_ * fVar178;
  fVar155 = auVar158._8_4_ * fVar178;
  fVar156 = auVar158._12_4_ * fVar178;
  auVar15 = vshufps_avx(auVar251,auVar251,0xff);
  auVar16 = vshufps_avx(auVar23,auVar23,0xff);
  auVar244._0_4_ = auVar16._0_4_ * fVar118;
  auVar244._4_4_ = auVar16._4_4_ * fVar133;
  auVar244._8_4_ = auVar16._8_4_ * fVar134;
  auVar244._12_4_ = auVar16._12_4_ * fVar135;
  auVar159._0_4_ = auVar15._0_4_ * fVar118 + fVar77 * auVar21._0_4_ * fVar138 * auVar16._0_4_;
  auVar159._4_4_ = auVar15._4_4_ * fVar133 + fVar77 * auVar21._4_4_ * fVar138 * auVar16._4_4_;
  auVar159._8_4_ = auVar15._8_4_ * fVar134 + fVar77 * auVar21._8_4_ * fVar138 * auVar16._8_4_;
  auVar159._12_4_ = auVar15._12_4_ * fVar135 + fVar77 * auVar21._12_4_ * fVar138 * auVar16._12_4_;
  auVar21 = vsubps_avx(auVar23,auVar244);
  fVar196 = auVar244._0_4_ + auVar23._0_4_;
  fVar215 = auVar244._4_4_ + auVar23._4_4_;
  fVar217 = auVar244._8_4_ + auVar23._8_4_;
  fVar218 = auVar244._12_4_ + auVar23._12_4_;
  auVar158 = vsubps_avx(auVar251,auVar159);
  auVar15 = vshufps_avx(auVar120,auVar120,0xff);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar141._0_4_ = auVar16._0_4_ * fVar136;
  auVar141._4_4_ = auVar16._4_4_ * fVar154;
  auVar141._8_4_ = auVar16._8_4_ * fVar155;
  auVar141._12_4_ = auVar16._12_4_ * fVar156;
  auVar160._0_4_ = auVar15._0_4_ * fVar136 + auVar16._0_4_ * fVar178 * auVar17._0_4_ * fVar195;
  auVar160._4_4_ = auVar15._4_4_ * fVar154 + auVar16._4_4_ * fVar178 * auVar17._4_4_ * fVar195;
  auVar160._8_4_ = auVar15._8_4_ * fVar155 + auVar16._8_4_ * fVar178 * auVar17._8_4_ * fVar195;
  auVar160._12_4_ = auVar15._12_4_ * fVar156 + auVar16._12_4_ * fVar178 * auVar17._12_4_ * fVar195;
  auVar17 = vsubps_avx(auVar24,auVar141);
  local_618._4_4_ = auVar24._4_4_ + auVar141._4_4_;
  local_618._0_4_ = auVar24._0_4_ + auVar141._0_4_;
  fStack_610 = auVar24._8_4_ + auVar141._8_4_;
  fStack_60c = auVar24._12_4_ + auVar141._12_4_;
  auVar22 = vsubps_avx(auVar120,auVar160);
  auVar87._8_4_ = 0x3e2aaaab;
  auVar87._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar87._12_4_ = 0x3e2aaaab;
  auVar312._0_4_ = (float)local_668._0_4_ * 0.16666667;
  auVar312._4_4_ = (float)local_668._4_4_ * 0.16666667;
  auVar312._8_4_ = fStack_660 * 0.16666667;
  auVar312._12_4_ = fVar137 * 0.16666667;
  auVar142._8_4_ = 0x3f2aaaab;
  auVar142._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar142._12_4_ = 0x3f2aaaab;
  auVar15 = vfmadd231ps_fma(auVar312,auVar142,auVar18);
  auVar16 = vfmadd231ps_fma(auVar82,auVar19,auVar142);
  auVar18 = vfmadd231ps_fma(auVar15,auVar19,auVar87);
  auVar23 = vfmadd231ps_fma(auVar16,auVar20,auVar87);
  auVar19 = vpermilps_avx(auVar95,0xc9);
  auVar15 = vdpps_avx(auVar19,auVar19,0x7f);
  auVar24 = vfmadd231ps_fma(auVar18,auVar20,ZEXT816(0) << 0x40);
  fVar178 = auVar15._0_4_;
  auVar161._4_12_ = ZEXT812(0) << 0x20;
  auVar161._0_4_ = fVar178;
  auVar16 = vrsqrtss_avx(auVar161,auVar161);
  fVar77 = auVar16._0_4_;
  fVar77 = fVar178 * -0.5 * fVar77 * fVar77 * fVar77 + fVar77 * 1.5;
  auVar16 = vpermilps_avx(auVar246,0xc9);
  auVar274._0_4_ = fVar178 * auVar16._0_4_;
  auVar274._4_4_ = fVar178 * auVar16._4_4_;
  auVar274._8_4_ = fVar178 * auVar16._8_4_;
  auVar274._12_4_ = fVar178 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar19,auVar16,0x7f);
  fVar178 = auVar16._0_4_;
  auVar245._0_4_ = fVar178 * auVar19._0_4_;
  auVar245._4_4_ = fVar178 * auVar19._4_4_;
  auVar245._8_4_ = fVar178 * auVar19._8_4_;
  auVar245._12_4_ = fVar178 * auVar19._12_4_;
  auVar18 = vsubps_avx(auVar274,auVar245);
  auVar16 = vrcpss_avx(auVar161,auVar161);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,auVar81);
  fVar138 = auVar16._0_4_ * auVar15._0_4_;
  fVar137 = auVar19._0_4_ * fVar77;
  fVar118 = auVar19._4_4_ * fVar77;
  fVar133 = auVar19._8_4_ * fVar77;
  fVar134 = auVar19._12_4_ * fVar77;
  auVar20 = vpermilps_avx(auVar101,0xc9);
  auVar15 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar195 = auVar15._0_4_;
  auVar246 = ZEXT416((uint)fVar195);
  auVar16 = vrsqrtss_avx(auVar246,auVar246);
  fVar178 = auVar16._0_4_;
  auVar19 = vpermilps_avx(auVar119,0xc9);
  auVar16 = vdpps_avx(auVar20,auVar19,0x7f);
  fVar178 = fVar178 * 1.5 + fVar195 * -0.5 * fVar178 * fVar178 * fVar178;
  auVar290._0_4_ = fVar195 * auVar19._0_4_;
  auVar290._4_4_ = fVar195 * auVar19._4_4_;
  auVar290._8_4_ = fVar195 * auVar19._8_4_;
  auVar290._12_4_ = fVar195 * auVar19._12_4_;
  fVar195 = auVar16._0_4_;
  auVar330._0_4_ = fVar195 * auVar20._0_4_;
  auVar330._4_4_ = fVar195 * auVar20._4_4_;
  auVar330._8_4_ = fVar195 * auVar20._8_4_;
  auVar330._12_4_ = fVar195 * auVar20._12_4_;
  auVar19 = vsubps_avx(auVar290,auVar330);
  auVar16 = vrcpss_avx(auVar246,auVar246);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,auVar81);
  fVar195 = auVar16._0_4_ * auVar15._0_4_;
  fVar135 = fVar178 * auVar20._0_4_;
  fVar136 = fVar178 * auVar20._4_4_;
  fVar154 = fVar178 * auVar20._8_4_;
  fVar155 = fVar178 * auVar20._12_4_;
  auVar15 = vshufps_avx(auVar157,auVar157,0xff);
  auVar16 = vshufps_avx(auVar23,auVar23,0xff);
  auVar143._0_4_ = auVar16._0_4_ * fVar137;
  auVar143._4_4_ = auVar16._4_4_ * fVar118;
  auVar143._8_4_ = auVar16._8_4_ * fVar133;
  auVar143._12_4_ = auVar16._12_4_ * fVar134;
  auVar104._0_4_ = auVar15._0_4_ * fVar137 + auVar16._0_4_ * fVar77 * auVar18._0_4_ * fVar138;
  auVar104._4_4_ = auVar15._4_4_ * fVar118 + auVar16._4_4_ * fVar77 * auVar18._4_4_ * fVar138;
  auVar104._8_4_ = auVar15._8_4_ * fVar133 + auVar16._8_4_ * fVar77 * auVar18._8_4_ * fVar138;
  auVar104._12_4_ = auVar15._12_4_ * fVar134 + auVar16._12_4_ * fVar77 * auVar18._12_4_ * fVar138;
  auVar18 = vsubps_avx(auVar23,auVar143);
  fVar138 = auVar23._0_4_ + auVar143._0_4_;
  fVar137 = auVar23._4_4_ + auVar143._4_4_;
  fVar118 = auVar23._8_4_ + auVar143._8_4_;
  fVar133 = auVar23._12_4_ + auVar143._12_4_;
  auVar20 = vsubps_avx(auVar157,auVar104);
  auVar15 = vshufps_avx(auVar179,auVar179,0xff);
  auVar16 = vshufps_avx(auVar24,auVar24,0xff);
  auVar162._0_4_ = auVar16._0_4_ * fVar135;
  auVar162._4_4_ = auVar16._4_4_ * fVar136;
  auVar162._8_4_ = auVar16._8_4_ * fVar154;
  auVar162._12_4_ = auVar16._12_4_ * fVar155;
  auVar105._0_4_ = auVar16._0_4_ * fVar178 * auVar19._0_4_ * fVar195 + auVar15._0_4_ * fVar135;
  auVar105._4_4_ = auVar16._4_4_ * fVar178 * auVar19._4_4_ * fVar195 + auVar15._4_4_ * fVar136;
  auVar105._8_4_ = auVar16._8_4_ * fVar178 * auVar19._8_4_ * fVar195 + auVar15._8_4_ * fVar154;
  auVar105._12_4_ = auVar16._12_4_ * fVar178 * auVar19._12_4_ * fVar195 + auVar15._12_4_ * fVar155;
  auVar15 = vsubps_avx(auVar24,auVar162);
  auVar163._0_4_ = auVar24._0_4_ + auVar162._0_4_;
  auVar163._4_4_ = auVar24._4_4_ + auVar162._4_4_;
  auVar163._8_4_ = auVar24._8_4_ + auVar162._8_4_;
  auVar163._12_4_ = auVar24._12_4_ + auVar162._12_4_;
  auVar16 = vsubps_avx(auVar179,auVar105);
  local_4f8 = auVar158._0_4_;
  fStack_4f4 = auVar158._4_4_;
  fStack_4f0 = auVar158._8_4_;
  fStack_4ec = auVar158._12_4_;
  auVar184._0_4_ = auVar21._0_4_ + local_4f8 * 0.33333334;
  auVar184._4_4_ = auVar21._4_4_ + fStack_4f4 * 0.33333334;
  auVar184._8_4_ = auVar21._8_4_ + fStack_4f0 * 0.33333334;
  auVar184._12_4_ = auVar21._12_4_ + fStack_4ec * 0.33333334;
  fVar77 = 1.0 - fVar194;
  auVar106._4_4_ = fVar77;
  auVar106._0_4_ = fVar77;
  auVar106._8_4_ = fVar77;
  auVar106._12_4_ = fVar77;
  auVar291._0_4_ = fVar194 * auVar18._0_4_;
  auVar291._4_4_ = fVar194 * auVar18._4_4_;
  auVar291._8_4_ = fVar194 * auVar18._8_4_;
  auVar291._12_4_ = fVar194 * auVar18._12_4_;
  local_3c8 = vfmadd231ps_fma(auVar291,auVar106,auVar21);
  auVar121._0_4_ = fVar194 * (auVar18._0_4_ + auVar20._0_4_ * 0.33333334);
  auVar121._4_4_ = fVar194 * (auVar18._4_4_ + auVar20._4_4_ * 0.33333334);
  auVar121._8_4_ = fVar194 * (auVar18._8_4_ + auVar20._8_4_ * 0.33333334);
  auVar121._12_4_ = fVar194 * (auVar18._12_4_ + auVar20._12_4_ * 0.33333334);
  auVar21 = vfmadd231ps_fma(auVar121,auVar106,auVar184);
  local_628 = auVar22._0_4_;
  fStack_624 = auVar22._4_4_;
  fStack_620 = auVar22._8_4_;
  fStack_61c = auVar22._12_4_;
  auVar122._0_4_ = local_628 * 0.33333334;
  auVar122._4_4_ = fStack_624 * 0.33333334;
  auVar122._8_4_ = fStack_620 * 0.33333334;
  auVar122._12_4_ = fStack_61c * 0.33333334;
  auVar18 = vsubps_avx(auVar17,auVar122);
  auVar56._4_4_ = fVar215;
  auVar56._0_4_ = fVar196;
  auVar56._8_4_ = fVar217;
  auVar56._12_4_ = fVar218;
  auVar313._0_4_ = fVar196 + (fVar287 + auVar159._0_4_) * 0.33333334;
  auVar313._4_4_ = fVar215 + (fVar221 + auVar159._4_4_) * 0.33333334;
  auVar313._8_4_ = fVar217 + (fVar222 + auVar159._8_4_) * 0.33333334;
  auVar313._12_4_ = fVar218 + (fVar239 + auVar159._12_4_) * 0.33333334;
  auVar199._0_4_ = (fVar260 + auVar160._0_4_) * 0.33333334;
  auVar199._4_4_ = (fVar271 + auVar160._4_4_) * 0.33333334;
  auVar199._8_4_ = (fVar326 + auVar160._8_4_) * 0.33333334;
  auVar199._12_4_ = (fVar336 + auVar160._12_4_) * 0.33333334;
  auVar19 = vsubps_avx(_local_618,auVar199);
  auVar292._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar292._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar292._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar292._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar15,auVar292);
  auVar264._0_4_ = (fVar272 + auVar105._0_4_) * 0.33333334;
  auVar264._4_4_ = (fVar197 + auVar105._4_4_) * 0.33333334;
  auVar264._8_4_ = (fVar284 + auVar105._8_4_) * 0.33333334;
  auVar264._12_4_ = (fVar216 + auVar105._12_4_) * 0.33333334;
  auVar20 = vsubps_avx(auVar163,auVar264);
  auVar293._0_4_ = fVar194 * auVar16._0_4_;
  auVar293._4_4_ = fVar194 * auVar16._4_4_;
  auVar293._8_4_ = fVar194 * auVar16._8_4_;
  auVar293._12_4_ = fVar194 * auVar16._12_4_;
  auVar247._0_4_ = fVar194 * auVar15._0_4_;
  auVar247._4_4_ = fVar194 * auVar15._4_4_;
  auVar247._8_4_ = fVar194 * auVar15._8_4_;
  auVar247._12_4_ = fVar194 * auVar15._12_4_;
  local_3d8 = vfmadd231ps_fma(auVar293,auVar106,auVar18);
  auVar158 = vfmadd231ps_fma(auVar247,auVar106,auVar17);
  auVar123._0_4_ = fVar194 * fVar138;
  auVar123._4_4_ = fVar194 * fVar137;
  auVar123._8_4_ = fVar194 * fVar118;
  auVar123._12_4_ = fVar194 * fVar133;
  auVar144._0_4_ = fVar194 * (fVar138 + (fVar285 + auVar104._0_4_) * 0.33333334);
  auVar144._4_4_ = fVar194 * (fVar137 + (fVar219 + auVar104._4_4_) * 0.33333334);
  auVar144._8_4_ = fVar194 * (fVar118 + (fVar286 + auVar104._8_4_) * 0.33333334);
  auVar144._12_4_ = fVar194 * (fVar133 + (fVar220 + auVar104._12_4_) * 0.33333334);
  auVar226._0_4_ = fVar194 * auVar20._0_4_;
  auVar226._4_4_ = fVar194 * auVar20._4_4_;
  auVar226._8_4_ = fVar194 * auVar20._8_4_;
  auVar226._12_4_ = fVar194 * auVar20._12_4_;
  auVar164._0_4_ = fVar194 * auVar163._0_4_;
  auVar164._4_4_ = fVar194 * auVar163._4_4_;
  auVar164._8_4_ = fVar194 * auVar163._8_4_;
  auVar164._12_4_ = fVar194 * auVar163._12_4_;
  _local_3e8 = vfmadd231ps_fma(auVar123,auVar106,auVar56);
  _local_3f8 = vfmadd231ps_fma(auVar144,auVar106,auVar313);
  auVar22 = vfmadd231ps_fma(auVar226,auVar106,auVar19);
  auVar23 = vfmadd231ps_fma(auVar164,auVar106,_local_618);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3a8 = vsubps_avx(local_3c8,auVar15);
  auVar16 = vshufps_avx(local_3a8,local_3a8,0x55);
  auVar17 = vshufps_avx(local_3a8,local_3a8,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar77 = pre->ray_space[k].vz.field_0.m128[0];
  fVar178 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar138 = pre->ray_space[k].vz.field_0.m128[3];
  auVar88._0_4_ = fVar77 * auVar17._0_4_;
  auVar88._4_4_ = fVar178 * auVar17._4_4_;
  auVar88._8_4_ = fVar194 * auVar17._8_4_;
  auVar88._12_4_ = fVar138 * auVar17._12_4_;
  auVar18 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar16);
  local_3b8 = vsubps_avx(auVar21,auVar15);
  auVar16 = vshufps_avx(local_3b8,local_3b8,0x55);
  auVar17 = vshufps_avx(local_3b8,local_3b8,0xaa);
  auVar340._0_4_ = fVar77 * auVar17._0_4_;
  auVar340._4_4_ = fVar178 * auVar17._4_4_;
  auVar340._8_4_ = fVar194 * auVar17._8_4_;
  auVar340._12_4_ = fVar138 * auVar17._12_4_;
  auVar17 = vfmadd231ps_fma(auVar340,(undefined1  [16])aVar5,auVar16);
  local_2a8 = vsubps_avx(local_3d8,auVar15);
  auVar16 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar331._0_4_ = fVar77 * auVar16._0_4_;
  auVar331._4_4_ = fVar178 * auVar16._4_4_;
  auVar331._8_4_ = fVar194 * auVar16._8_4_;
  auVar331._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2a8,local_2a8,0x55);
  auVar19 = vfmadd231ps_fma(auVar331,(undefined1  [16])aVar5,auVar16);
  local_2b8 = vsubps_avx(auVar158,auVar15);
  auVar16 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar314._0_4_ = fVar77 * auVar16._0_4_;
  auVar314._4_4_ = fVar178 * auVar16._4_4_;
  auVar314._8_4_ = fVar194 * auVar16._8_4_;
  auVar314._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar20 = vfmadd231ps_fma(auVar314,(undefined1  [16])aVar5,auVar16);
  local_2c8 = vsubps_avx(_local_3e8,auVar15);
  auVar16 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar165._0_4_ = fVar77 * auVar16._0_4_;
  auVar165._4_4_ = fVar178 * auVar16._4_4_;
  auVar165._8_4_ = fVar194 * auVar16._8_4_;
  auVar165._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2c8,local_2c8,0x55);
  auVar24 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar5,auVar16);
  local_2d8 = vsubps_avx(_local_3f8,auVar15);
  auVar16 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar227._0_4_ = fVar77 * auVar16._0_4_;
  auVar227._4_4_ = fVar178 * auVar16._4_4_;
  auVar227._8_4_ = fVar194 * auVar16._8_4_;
  auVar227._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar246 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar16);
  local_2e8 = vsubps_avx(auVar22,auVar15);
  auVar16 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar265._0_4_ = fVar77 * auVar16._0_4_;
  auVar265._4_4_ = fVar178 * auVar16._4_4_;
  auVar265._8_4_ = fVar194 * auVar16._8_4_;
  auVar265._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar16 = vfmadd231ps_fma(auVar265,(undefined1  [16])aVar5,auVar16);
  local_2f8 = vsubps_avx(auVar23,auVar15);
  auVar15 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar185._0_4_ = fVar77 * auVar15._0_4_;
  auVar185._4_4_ = fVar178 * auVar15._4_4_;
  auVar185._8_4_ = fVar194 * auVar15._8_4_;
  auVar185._12_4_ = fVar138 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar15 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar15);
  auVar200._4_4_ = local_3a8._0_4_;
  auVar200._0_4_ = local_3a8._0_4_;
  auVar200._8_4_ = local_3a8._0_4_;
  auVar200._12_4_ = local_3a8._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar81 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar200);
  auVar201._4_4_ = local_3b8._0_4_;
  auVar201._0_4_ = local_3b8._0_4_;
  auVar201._8_4_ = local_3b8._0_4_;
  auVar201._12_4_ = local_3b8._0_4_;
  auVar82 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar201);
  uVar78 = local_2a8._0_4_;
  auVar202._4_4_ = uVar78;
  auVar202._0_4_ = uVar78;
  auVar202._8_4_ = uVar78;
  auVar202._12_4_ = uVar78;
  auVar79 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar202);
  uVar78 = local_2b8._0_4_;
  auVar203._4_4_ = uVar78;
  auVar203._0_4_ = uVar78;
  auVar203._8_4_ = uVar78;
  auVar203._12_4_ = uVar78;
  auVar80 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar203);
  uVar78 = local_2c8._0_4_;
  auVar204._4_4_ = uVar78;
  auVar204._0_4_ = uVar78;
  auVar204._8_4_ = uVar78;
  auVar204._12_4_ = uVar78;
  auVar24 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar5,auVar204);
  uVar78 = local_2d8._0_4_;
  auVar205._4_4_ = uVar78;
  auVar205._0_4_ = uVar78;
  auVar205._8_4_ = uVar78;
  auVar205._12_4_ = uVar78;
  auVar246 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar5,auVar205);
  uVar78 = local_2e8._0_4_;
  auVar206._4_4_ = uVar78;
  auVar206._0_4_ = uVar78;
  auVar206._8_4_ = uVar78;
  auVar206._12_4_ = uVar78;
  auVar93 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar206);
  uVar78 = local_2f8._0_4_;
  auVar207._4_4_ = uVar78;
  auVar207._0_4_ = uVar78;
  auVar207._8_4_ = uVar78;
  auVar207._12_4_ = uVar78;
  auVar94 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar207);
  auVar18 = vmovlhps_avx(auVar81,auVar24);
  auVar19 = vmovlhps_avx(auVar82,auVar246);
  auVar20 = vmovlhps_avx(auVar79,auVar93);
  _local_398 = vmovlhps_avx(auVar80,auVar94);
  auVar15 = vminps_avx(auVar18,auVar19);
  auVar16 = vminps_avx(auVar20,_local_398);
  auVar17 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar18,auVar19);
  auVar16 = vmaxps_avx(auVar20,_local_398);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vshufpd_avx(auVar17,auVar17,3);
  auVar17 = vminps_avx(auVar17,auVar16);
  auVar16 = vshufpd_avx(auVar15,auVar15,3);
  auVar16 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vandps_avx(auVar17,auVar337);
  auVar16 = vandps_avx(auVar16,auVar337);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar16,auVar15);
  local_198 = auVar15._0_4_ * 9.536743e-07;
  auVar208._8_8_ = auVar81._0_8_;
  auVar208._0_8_ = auVar81._0_8_;
  auVar248._8_8_ = auVar82._0_8_;
  auVar248._0_8_ = auVar82._0_8_;
  auVar275._8_8_ = auVar79._0_8_;
  auVar275._0_8_ = auVar79._0_8_;
  auVar315._0_8_ = auVar80._0_8_;
  auVar315._8_8_ = auVar315._0_8_;
  local_298 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = -local_198;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_368 = uVar69;
  uStack_364 = uVar69;
  uStack_360 = uVar69;
  uStack_35c = uVar69;
  local_378 = uVar7;
  uStack_374 = uVar7;
  uStack_370 = uVar7;
  uStack_36c = uVar7;
  uVar70 = 0;
  fVar77 = *(float *)(ray + k * 4 + 0x30);
  auVar15 = vsubps_avx(auVar19,auVar18);
  auVar16 = vsubps_avx(auVar20,auVar19);
  auVar17 = vsubps_avx(_local_398,auVar20);
  local_318 = vsubps_avx(_local_3e8,local_3c8);
  local_328 = vsubps_avx(_local_3f8,auVar21);
  local_338 = vsubps_avx(auVar22,local_3d8);
  _local_348 = vsubps_avx(auVar23,auVar158);
  _local_668 = ZEXT816(0x3f80000000000000);
  local_308 = _local_668;
  do {
    auVar81 = vshufps_avx(_local_668,_local_668,0x50);
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = &DAT_3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar151._16_4_ = 0x3f800000;
    auVar151._0_16_ = auVar145;
    auVar151._20_4_ = 0x3f800000;
    auVar151._24_4_ = 0x3f800000;
    auVar151._28_4_ = 0x3f800000;
    auVar82 = vsubps_avx(auVar145,auVar81);
    fVar178 = auVar81._0_4_;
    fVar135 = auVar24._0_4_;
    auVar89._0_4_ = fVar135 * fVar178;
    fVar194 = auVar81._4_4_;
    fVar136 = auVar24._4_4_;
    auVar89._4_4_ = fVar136 * fVar194;
    fVar138 = auVar81._8_4_;
    auVar89._8_4_ = fVar135 * fVar138;
    fVar195 = auVar81._12_4_;
    auVar89._12_4_ = fVar136 * fVar195;
    fVar222 = auVar246._0_4_;
    auVar186._0_4_ = fVar222 * fVar178;
    fVar239 = auVar246._4_4_;
    auVar186._4_4_ = fVar239 * fVar194;
    auVar186._8_4_ = fVar222 * fVar138;
    auVar186._12_4_ = fVar239 * fVar195;
    fVar260 = auVar93._0_4_;
    auVar228._0_4_ = fVar260 * fVar178;
    fVar271 = auVar93._4_4_;
    auVar228._4_4_ = fVar271 * fVar194;
    auVar228._8_4_ = fVar260 * fVar138;
    auVar228._12_4_ = fVar271 * fVar195;
    fVar326 = auVar94._0_4_;
    auVar301._0_4_ = fVar326 * fVar178;
    fVar336 = auVar94._4_4_;
    auVar301._4_4_ = fVar336 * fVar194;
    auVar301._8_4_ = fVar326 * fVar138;
    auVar301._12_4_ = fVar336 * fVar195;
    auVar95 = vfmadd231ps_fma(auVar89,auVar82,auVar208);
    auVar101 = vfmadd231ps_fma(auVar186,auVar82,auVar248);
    auVar119 = vfmadd231ps_fma(auVar228,auVar82,auVar275);
    auVar251 = vfmadd231ps_fma(auVar301,auVar315,auVar82);
    local_5c8 = auVar251._0_4_;
    auVar81 = vmovshdup_avx(local_308);
    fVar178 = local_308._0_4_;
    fVar137 = (auVar81._0_4_ - fVar178) * 0.04761905;
    auVar259._4_4_ = fVar178;
    auVar259._0_4_ = fVar178;
    auVar259._8_4_ = fVar178;
    auVar259._12_4_ = fVar178;
    auVar259._16_4_ = fVar178;
    auVar259._20_4_ = fVar178;
    auVar259._24_4_ = fVar178;
    auVar259._28_4_ = fVar178;
    auVar130._0_8_ = auVar81._0_8_;
    auVar130._8_8_ = auVar130._0_8_;
    auVar130._16_8_ = auVar130._0_8_;
    auVar130._24_8_ = auVar130._0_8_;
    auVar92 = vsubps_avx(auVar130,auVar259);
    uVar78 = auVar95._0_4_;
    auVar344._4_4_ = uVar78;
    auVar344._0_4_ = uVar78;
    auVar344._8_4_ = uVar78;
    auVar344._12_4_ = uVar78;
    auVar344._16_4_ = uVar78;
    auVar344._20_4_ = uVar78;
    auVar344._24_4_ = uVar78;
    auVar344._28_4_ = uVar78;
    auVar81 = vmovshdup_avx(auVar95);
    uVar198 = auVar81._0_8_;
    auVar324._8_8_ = uVar198;
    auVar324._0_8_ = uVar198;
    auVar324._16_8_ = uVar198;
    auVar324._24_8_ = uVar198;
    fVar118 = auVar101._0_4_;
    auVar115._4_4_ = fVar118;
    auVar115._0_4_ = fVar118;
    auVar115._8_4_ = fVar118;
    auVar115._12_4_ = fVar118;
    auVar115._16_4_ = fVar118;
    auVar115._20_4_ = fVar118;
    auVar115._24_4_ = fVar118;
    auVar115._28_4_ = fVar118;
    auVar82 = vmovshdup_avx(auVar101);
    auVar212._0_8_ = auVar82._0_8_;
    auVar212._8_8_ = auVar212._0_8_;
    auVar212._16_8_ = auVar212._0_8_;
    auVar212._24_8_ = auVar212._0_8_;
    fVar154 = auVar119._0_4_;
    auVar299._4_4_ = fVar154;
    auVar299._0_4_ = fVar154;
    auVar299._8_4_ = fVar154;
    auVar299._12_4_ = fVar154;
    auVar299._16_4_ = fVar154;
    auVar299._20_4_ = fVar154;
    auVar299._24_4_ = fVar154;
    auVar299._28_4_ = fVar154;
    auVar79 = vmovshdup_avx(auVar119);
    auVar270._0_8_ = auVar79._0_8_;
    auVar270._8_8_ = auVar270._0_8_;
    auVar270._16_8_ = auVar270._0_8_;
    auVar270._24_8_ = auVar270._0_8_;
    auVar80 = vmovshdup_avx(auVar251);
    auVar120 = vfmadd132ps_fma(auVar92,auVar259,_DAT_02020f20);
    auVar92 = vsubps_avx(auVar151,ZEXT1632(auVar120));
    fVar178 = auVar120._0_4_;
    auVar333._0_4_ = fVar118 * fVar178;
    fVar194 = auVar120._4_4_;
    auVar333._4_4_ = fVar118 * fVar194;
    fVar138 = auVar120._8_4_;
    auVar333._8_4_ = fVar118 * fVar138;
    fVar195 = auVar120._12_4_;
    auVar333._12_4_ = fVar118 * fVar195;
    auVar333._16_4_ = fVar118 * 0.0;
    auVar333._20_4_ = fVar118 * 0.0;
    auVar333._24_4_ = fVar118 * 0.0;
    auVar333._28_4_ = 0;
    auVar120 = vfmadd231ps_fma(auVar333,auVar92,auVar344);
    fVar133 = auVar82._0_4_;
    auVar308._0_4_ = fVar133 * fVar178;
    fVar134 = auVar82._4_4_;
    auVar308._4_4_ = fVar134 * fVar194;
    auVar308._8_4_ = fVar133 * fVar138;
    auVar308._12_4_ = fVar134 * fVar195;
    auVar308._16_4_ = fVar133 * 0.0;
    auVar308._20_4_ = fVar134 * 0.0;
    auVar308._24_4_ = fVar133 * 0.0;
    auVar308._28_4_ = 0;
    auVar157 = vfmadd231ps_fma(auVar308,auVar92,auVar324);
    auVar25._4_4_ = fVar154 * fVar194;
    auVar25._0_4_ = fVar154 * fVar178;
    auVar25._8_4_ = fVar154 * fVar138;
    auVar25._12_4_ = fVar154 * fVar195;
    auVar25._16_4_ = fVar154 * 0.0;
    auVar25._20_4_ = fVar154 * 0.0;
    auVar25._24_4_ = fVar154 * 0.0;
    auVar25._28_4_ = auVar81._4_4_;
    auVar179 = vfmadd231ps_fma(auVar25,auVar92,auVar115);
    fVar133 = auVar79._0_4_;
    fVar134 = auVar79._4_4_;
    auVar26._4_4_ = fVar134 * fVar194;
    auVar26._0_4_ = fVar133 * fVar178;
    auVar26._8_4_ = fVar133 * fVar138;
    auVar26._12_4_ = fVar134 * fVar195;
    auVar26._16_4_ = fVar133 * 0.0;
    auVar26._20_4_ = fVar134 * 0.0;
    auVar26._24_4_ = fVar133 * 0.0;
    auVar26._28_4_ = uVar78;
    auVar168 = vfmadd231ps_fma(auVar26,auVar92,auVar212);
    auVar81 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar213._0_8_ = auVar81._0_8_;
    auVar213._8_8_ = auVar213._0_8_;
    auVar213._16_8_ = auVar213._0_8_;
    auVar213._24_8_ = auVar213._0_8_;
    auVar82 = vshufps_avx(auVar95,auVar95,0xff);
    uStack_5e0 = auVar82._0_8_;
    local_5e8 = (undefined1  [8])uStack_5e0;
    uStack_5d8 = uStack_5e0;
    uStack_5d0 = uStack_5e0;
    auVar27._4_4_ = fVar194 * local_5c8;
    auVar27._0_4_ = fVar178 * local_5c8;
    auVar27._8_4_ = fVar138 * local_5c8;
    auVar27._12_4_ = fVar195 * local_5c8;
    auVar27._16_4_ = local_5c8 * 0.0;
    auVar27._20_4_ = local_5c8 * 0.0;
    auVar27._24_4_ = local_5c8 * 0.0;
    auVar27._28_4_ = 0x3f800000;
    auVar189 = vfmadd231ps_fma(auVar27,auVar92,auVar299);
    auVar79 = vshufps_avx(auVar101,auVar101,0xaa);
    auVar176._0_8_ = auVar79._0_8_;
    auVar176._8_8_ = auVar176._0_8_;
    auVar176._16_8_ = auVar176._0_8_;
    auVar176._24_8_ = auVar176._0_8_;
    auVar95 = vshufps_avx(auVar101,auVar101,0xff);
    auVar193._0_8_ = auVar95._0_8_;
    auVar193._8_8_ = auVar193._0_8_;
    auVar193._16_8_ = auVar193._0_8_;
    auVar193._24_8_ = auVar193._0_8_;
    fVar133 = auVar80._0_4_;
    fVar134 = auVar80._4_4_;
    auVar28._4_4_ = fVar134 * fVar194;
    auVar28._0_4_ = fVar133 * fVar178;
    auVar28._8_4_ = fVar133 * fVar138;
    auVar28._12_4_ = fVar134 * fVar195;
    auVar28._16_4_ = fVar133 * 0.0;
    auVar28._20_4_ = fVar134 * 0.0;
    auVar28._24_4_ = fVar133 * 0.0;
    auVar28._28_4_ = fVar154;
    auVar223 = vfmadd231ps_fma(auVar28,auVar92,auVar270);
    auVar29._28_4_ = fVar118;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar179._12_4_ * fVar195,
                            CONCAT48(auVar179._8_4_ * fVar138,
                                     CONCAT44(auVar179._4_4_ * fVar194,auVar179._0_4_ * fVar178))));
    auVar120 = vfmadd231ps_fma(auVar29,auVar92,ZEXT1632(auVar120));
    auVar30._28_4_ = auVar82._4_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar168._12_4_ * fVar195,
                            CONCAT48(auVar168._8_4_ * fVar138,
                                     CONCAT44(auVar168._4_4_ * fVar194,auVar168._0_4_ * fVar178))));
    auVar157 = vfmadd231ps_fma(auVar30,auVar92,ZEXT1632(auVar157));
    auVar82 = vshufps_avx(auVar119,auVar119,0xaa);
    uVar198 = auVar82._0_8_;
    auVar309._8_8_ = uVar198;
    auVar309._0_8_ = uVar198;
    auVar309._16_8_ = uVar198;
    auVar309._24_8_ = uVar198;
    auVar80 = vshufps_avx(auVar119,auVar119,0xff);
    uVar198 = auVar80._0_8_;
    auVar334._8_8_ = uVar198;
    auVar334._0_8_ = uVar198;
    auVar334._16_8_ = uVar198;
    auVar334._24_8_ = uVar198;
    auVar179 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar189._12_4_,
                                                  CONCAT48(fVar138 * auVar189._8_4_,
                                                           CONCAT44(fVar194 * auVar189._4_4_,
                                                                    fVar178 * auVar189._0_4_)))),
                               auVar92,ZEXT1632(auVar179));
    auVar101 = vshufps_avx(auVar251,auVar251,0xaa);
    auVar119 = vshufps_avx(auVar251,auVar251,0xff);
    local_5c8 = auVar119._0_4_;
    fStack_5c4 = auVar119._4_4_;
    auVar31._28_4_ = fStack_5c4;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(auVar223._12_4_ * fVar195,
                            CONCAT48(auVar223._8_4_ * fVar138,
                                     CONCAT44(auVar223._4_4_ * fVar194,auVar223._0_4_ * fVar178))));
    auVar119 = vfmadd231ps_fma(auVar31,auVar92,ZEXT1632(auVar168));
    auVar251 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar179._12_4_,
                                                  CONCAT48(fVar138 * auVar179._8_4_,
                                                           CONCAT44(fVar194 * auVar179._4_4_,
                                                                    fVar178 * auVar179._0_4_)))),
                               auVar92,ZEXT1632(auVar120));
    auVar25 = vsubps_avx(ZEXT1632(auVar179),ZEXT1632(auVar120));
    auVar120 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar119._12_4_,
                                                  CONCAT48(fVar138 * auVar119._8_4_,
                                                           CONCAT44(fVar194 * auVar119._4_4_,
                                                                    fVar178 * auVar119._0_4_)))),
                               auVar92,ZEXT1632(auVar157));
    auVar26 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar157));
    fVar272 = fVar137 * auVar25._0_4_ * 3.0;
    fVar284 = fVar137 * auVar25._4_4_ * 3.0;
    auVar32._4_4_ = fVar284;
    auVar32._0_4_ = fVar272;
    fVar196 = fVar137 * auVar25._8_4_ * 3.0;
    auVar32._8_4_ = fVar196;
    fVar217 = fVar137 * auVar25._12_4_ * 3.0;
    auVar32._12_4_ = fVar217;
    fVar285 = fVar137 * auVar25._16_4_ * 3.0;
    auVar32._16_4_ = fVar285;
    fVar286 = fVar137 * auVar25._20_4_ * 3.0;
    auVar32._20_4_ = fVar286;
    fVar287 = fVar137 * auVar25._24_4_ * 3.0;
    auVar32._24_4_ = fVar287;
    auVar32._28_4_ = 0x40400000;
    local_648._0_4_ = fVar137 * auVar26._0_4_ * 3.0;
    local_648._4_4_ = fVar137 * auVar26._4_4_ * 3.0;
    fStack_640 = fVar137 * auVar26._8_4_ * 3.0;
    fStack_63c = fVar137 * auVar26._12_4_ * 3.0;
    fStack_638 = fVar137 * auVar26._16_4_ * 3.0;
    fStack_634 = fVar137 * auVar26._20_4_ * 3.0;
    fStack_630 = fVar137 * auVar26._24_4_ * 3.0;
    fStack_62c = auVar26._28_4_;
    fVar118 = auVar79._0_4_;
    fVar133 = auVar79._4_4_;
    auVar310._4_4_ = fVar133 * fVar194;
    auVar310._0_4_ = fVar118 * fVar178;
    auVar310._8_4_ = fVar118 * fVar138;
    auVar310._12_4_ = fVar133 * fVar195;
    auVar310._16_4_ = fVar118 * 0.0;
    auVar310._20_4_ = fVar133 * 0.0;
    auVar310._24_4_ = fVar118 * 0.0;
    auVar310._28_4_ = auVar25._28_4_;
    auVar79 = vfmadd231ps_fma(auVar310,auVar92,auVar213);
    fVar118 = auVar95._0_4_;
    fVar134 = auVar95._4_4_;
    auVar34._4_4_ = fVar134 * fVar194;
    auVar34._0_4_ = fVar118 * fVar178;
    auVar34._8_4_ = fVar118 * fVar138;
    auVar34._12_4_ = fVar134 * fVar195;
    auVar34._16_4_ = fVar118 * 0.0;
    auVar34._20_4_ = fVar134 * 0.0;
    auVar34._24_4_ = fVar118 * 0.0;
    auVar34._28_4_ = auVar81._4_4_;
    auVar81 = vfmadd231ps_fma(auVar34,auVar92,_local_5e8);
    fVar118 = auVar82._0_4_;
    fVar134 = auVar82._4_4_;
    auVar35._4_4_ = fVar134 * fVar194;
    auVar35._0_4_ = fVar118 * fVar178;
    auVar35._8_4_ = fVar118 * fVar138;
    auVar35._12_4_ = fVar134 * fVar195;
    auVar35._16_4_ = fVar118 * 0.0;
    auVar35._20_4_ = fVar134 * 0.0;
    auVar35._24_4_ = fVar118 * 0.0;
    auVar35._28_4_ = fVar137;
    auVar82 = vfmadd231ps_fma(auVar35,auVar92,auVar176);
    fVar118 = auVar80._0_4_;
    fVar154 = auVar80._4_4_;
    auVar36._4_4_ = fVar154 * fVar194;
    auVar36._0_4_ = fVar118 * fVar178;
    auVar36._8_4_ = fVar118 * fVar138;
    auVar36._12_4_ = fVar154 * fVar195;
    auVar36._16_4_ = fVar118 * 0.0;
    auVar36._20_4_ = fVar154 * 0.0;
    auVar36._24_4_ = fVar118 * 0.0;
    auVar36._28_4_ = fVar133;
    auVar80 = vfmadd231ps_fma(auVar36,auVar92,auVar193);
    auVar29 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar251));
    fVar118 = auVar101._0_4_;
    fVar133 = auVar101._4_4_;
    auVar37._4_4_ = fVar133 * fVar194;
    auVar37._0_4_ = fVar118 * fVar178;
    auVar37._8_4_ = fVar118 * fVar138;
    auVar37._12_4_ = fVar133 * fVar195;
    auVar37._16_4_ = fVar118 * 0.0;
    auVar37._20_4_ = fVar133 * 0.0;
    auVar37._24_4_ = fVar118 * 0.0;
    auVar37._28_4_ = auVar29._28_4_;
    auVar95 = vfmadd231ps_fma(auVar37,auVar92,auVar309);
    auVar30 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar120));
    auVar38._4_4_ = fVar194 * fStack_5c4;
    auVar38._0_4_ = fVar178 * local_5c8;
    auVar38._8_4_ = fVar138 * local_5c8;
    auVar38._12_4_ = fVar195 * fStack_5c4;
    auVar38._16_4_ = local_5c8 * 0.0;
    auVar38._20_4_ = fStack_5c4 * 0.0;
    auVar38._24_4_ = local_5c8 * 0.0;
    auVar38._28_4_ = fVar134;
    auVar101 = vfmadd231ps_fma(auVar38,auVar92,auVar334);
    auVar39._28_4_ = fVar133;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(fVar195 * auVar82._12_4_,
                            CONCAT48(fVar138 * auVar82._8_4_,
                                     CONCAT44(fVar194 * auVar82._4_4_,fVar178 * auVar82._0_4_))));
    auVar79 = vfmadd231ps_fma(auVar39,auVar92,ZEXT1632(auVar79));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar80._12_4_,
                                                 CONCAT48(fVar138 * auVar80._8_4_,
                                                          CONCAT44(fVar194 * auVar80._4_4_,
                                                                   fVar178 * auVar80._0_4_)))),
                              auVar92,ZEXT1632(auVar81));
    fVar272 = auVar251._0_4_ + fVar272;
    fVar284 = auVar251._4_4_ + fVar284;
    fVar196 = auVar251._8_4_ + fVar196;
    fVar217 = auVar251._12_4_ + fVar217;
    fVar285 = fVar285 + 0.0;
    fVar286 = fVar286 + 0.0;
    fVar287 = fVar287 + 0.0;
    auVar40._28_4_ = 0x40400000;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(auVar101._12_4_ * fVar195,
                            CONCAT48(auVar101._8_4_ * fVar138,
                                     CONCAT44(auVar101._4_4_ * fVar194,auVar101._0_4_ * fVar178))));
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar95._12_4_,
                                                 CONCAT48(fVar138 * auVar95._8_4_,
                                                          CONCAT44(fVar194 * auVar95._4_4_,
                                                                   fVar178 * auVar95._0_4_)))),
                              auVar92,ZEXT1632(auVar82));
    auVar80 = vfmadd231ps_fma(auVar40,auVar92,ZEXT1632(auVar80));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar82._12_4_,
                                                 CONCAT48(fVar138 * auVar82._8_4_,
                                                          CONCAT44(fVar194 * auVar82._4_4_,
                                                                   fVar178 * auVar82._0_4_)))),
                              auVar92,ZEXT1632(auVar79));
    auVar101 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar80._12_4_,
                                                  CONCAT48(fVar138 * auVar80._8_4_,
                                                           CONCAT44(fVar194 * auVar80._4_4_,
                                                                    fVar178 * auVar80._0_4_)))),
                               ZEXT1632(auVar81),auVar92);
    auVar92 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar79));
    auVar25 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar81));
    fVar178 = fVar137 * auVar92._0_4_ * 3.0;
    fVar194 = fVar137 * auVar92._4_4_ * 3.0;
    auVar41._4_4_ = fVar194;
    auVar41._0_4_ = fVar178;
    fVar138 = fVar137 * auVar92._8_4_ * 3.0;
    auVar41._8_4_ = fVar138;
    fVar195 = fVar137 * auVar92._12_4_ * 3.0;
    auVar41._12_4_ = fVar195;
    fVar154 = fVar137 * auVar92._16_4_ * 3.0;
    auVar41._16_4_ = fVar154;
    fVar155 = fVar137 * auVar92._20_4_ * 3.0;
    auVar41._20_4_ = fVar155;
    fVar156 = fVar137 * auVar92._24_4_ * 3.0;
    auVar41._24_4_ = fVar156;
    auVar41._28_4_ = 0x40400000;
    auVar238._0_4_ = fVar137 * auVar25._0_4_ * 3.0;
    auVar238._4_4_ = fVar137 * auVar25._4_4_ * 3.0;
    auVar238._8_4_ = fVar137 * auVar25._8_4_ * 3.0;
    auVar238._12_4_ = fVar137 * auVar25._12_4_ * 3.0;
    auVar238._16_4_ = fVar137 * auVar25._16_4_ * 3.0;
    auVar238._20_4_ = fVar137 * auVar25._20_4_ * 3.0;
    auVar238._24_4_ = fVar137 * auVar25._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    auVar31 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar95));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar101));
    auVar92 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar251));
    auVar25 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar120));
    auVar27 = vsubps_avx(auVar31,auVar29);
    fVar197 = auVar92._0_4_ + auVar27._0_4_;
    fVar216 = auVar92._4_4_ + auVar27._4_4_;
    fVar215 = auVar92._8_4_ + auVar27._8_4_;
    fVar218 = auVar92._12_4_ + auVar27._12_4_;
    fVar219 = auVar92._16_4_ + auVar27._16_4_;
    fVar220 = auVar92._20_4_ + auVar27._20_4_;
    fVar221 = auVar92._24_4_ + auVar27._24_4_;
    auVar28 = vsubps_avx(local_78,auVar30);
    auVar325._0_4_ = auVar25._0_4_ + auVar28._0_4_;
    auVar325._4_4_ = auVar25._4_4_ + auVar28._4_4_;
    auVar325._8_4_ = auVar25._8_4_ + auVar28._8_4_;
    auVar325._12_4_ = auVar25._12_4_ + auVar28._12_4_;
    auVar325._16_4_ = auVar25._16_4_ + auVar28._16_4_;
    auVar325._20_4_ = auVar25._20_4_ + auVar28._20_4_;
    auVar325._24_4_ = auVar25._24_4_ + auVar28._24_4_;
    auVar325._28_4_ = auVar25._28_4_ + auVar28._28_4_;
    fVar137 = auVar120._0_4_;
    local_158 = fVar137 + (float)local_648._0_4_;
    fVar118 = auVar120._4_4_;
    fStack_154 = fVar118 + (float)local_648._4_4_;
    fVar133 = auVar120._8_4_;
    fStack_150 = fVar133 + fStack_640;
    fVar134 = auVar120._12_4_;
    fStack_14c = fVar134 + fStack_63c;
    fStack_148 = fStack_638 + 0.0;
    fStack_144 = fStack_634 + 0.0;
    fStack_140 = fStack_630 + 0.0;
    fStack_13c = auVar26._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar251);
    auVar25 = vsubps_avx(local_98,auVar32);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar25);
    local_b8 = ZEXT1632(auVar120);
    auVar25 = vsubps_avx(local_b8,_local_648);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar25);
    local_f8._0_4_ = auVar95._0_4_ + fVar178;
    local_f8._4_4_ = auVar95._4_4_ + fVar194;
    local_f8._8_4_ = auVar95._8_4_ + fVar138;
    local_f8._12_4_ = auVar95._12_4_ + fVar195;
    local_f8._16_4_ = fVar154 + 0.0;
    local_f8._20_4_ = fVar155 + 0.0;
    local_f8._24_4_ = fVar156 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar310 = ZEXT1632(auVar95);
    auVar25 = vsubps_avx(auVar310,auVar41);
    auVar32 = vpermps_avx2(_DAT_0205d4a0,auVar25);
    fVar178 = auVar101._0_4_;
    local_138._0_4_ = fVar178 + auVar238._0_4_;
    fVar194 = auVar101._4_4_;
    local_138._4_4_ = fVar194 + auVar238._4_4_;
    fVar138 = auVar101._8_4_;
    local_138._8_4_ = fVar138 + auVar238._8_4_;
    fVar195 = auVar101._12_4_;
    local_138._12_4_ = fVar195 + auVar238._12_4_;
    local_138._16_4_ = auVar238._16_4_ + 0.0;
    local_138._20_4_ = auVar238._20_4_ + 0.0;
    local_138._24_4_ = auVar238._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar25 = vsubps_avx(ZEXT1632(auVar101),auVar238);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar25);
    auVar42._4_4_ = fVar118 * fVar216;
    auVar42._0_4_ = fVar137 * fVar197;
    auVar42._8_4_ = fVar133 * fVar215;
    auVar42._12_4_ = fVar134 * fVar218;
    auVar42._16_4_ = fVar219 * 0.0;
    auVar42._20_4_ = fVar220 * 0.0;
    auVar42._24_4_ = fVar221 * 0.0;
    auVar42._28_4_ = auVar25._28_4_;
    auVar81 = vfnmadd231ps_fma(auVar42,local_98,auVar325);
    auVar43._4_4_ = fStack_154 * fVar216;
    auVar43._0_4_ = local_158 * fVar197;
    auVar43._8_4_ = fStack_150 * fVar215;
    auVar43._12_4_ = fStack_14c * fVar218;
    auVar43._16_4_ = fStack_148 * fVar219;
    auVar43._20_4_ = fStack_144 * fVar220;
    auVar43._24_4_ = fStack_140 * fVar221;
    auVar43._28_4_ = auVar32._28_4_;
    auVar57._4_4_ = fVar284;
    auVar57._0_4_ = fVar272;
    auVar57._8_4_ = fVar196;
    auVar57._12_4_ = fVar217;
    auVar57._16_4_ = fVar285;
    auVar57._20_4_ = fVar286;
    auVar57._24_4_ = fVar287;
    auVar57._28_4_ = 0x40400000;
    auVar82 = vfnmadd231ps_fma(auVar43,auVar325,auVar57);
    auVar44._4_4_ = local_178._4_4_ * fVar216;
    auVar44._0_4_ = local_178._0_4_ * fVar197;
    auVar44._8_4_ = local_178._8_4_ * fVar215;
    auVar44._12_4_ = local_178._12_4_ * fVar218;
    auVar44._16_4_ = local_178._16_4_ * fVar219;
    auVar44._20_4_ = local_178._20_4_ * fVar220;
    auVar44._24_4_ = local_178._24_4_ * fVar221;
    auVar44._28_4_ = fStack_13c;
    auVar79 = vfnmadd231ps_fma(auVar44,local_d8,auVar325);
    local_5e8._0_4_ = auVar30._0_4_;
    local_5e8._4_4_ = auVar30._4_4_;
    uStack_5e0._0_4_ = auVar30._8_4_;
    uStack_5e0._4_4_ = auVar30._12_4_;
    uStack_5d8._0_4_ = auVar30._16_4_;
    uStack_5d8._4_4_ = auVar30._20_4_;
    uStack_5d0._0_4_ = auVar30._24_4_;
    auVar45._4_4_ = fVar216 * (float)local_5e8._4_4_;
    auVar45._0_4_ = fVar197 * (float)local_5e8._0_4_;
    auVar45._8_4_ = fVar215 * (float)uStack_5e0;
    auVar45._12_4_ = fVar218 * uStack_5e0._4_4_;
    auVar45._16_4_ = fVar219 * (float)uStack_5d8;
    auVar45._20_4_ = fVar220 * uStack_5d8._4_4_;
    auVar45._24_4_ = fVar221 * (float)uStack_5d0;
    auVar45._28_4_ = local_178._28_4_;
    auVar80 = vfnmadd231ps_fma(auVar45,auVar29,auVar325);
    auVar63._4_4_ = fVar194 * fVar216;
    auVar63._0_4_ = fVar178 * fVar197;
    auVar63._8_4_ = fVar138 * fVar215;
    auVar63._12_4_ = fVar195 * fVar218;
    auVar63._16_4_ = fVar219 * 0.0;
    auVar63._20_4_ = fVar220 * 0.0;
    auVar63._24_4_ = fVar221 * 0.0;
    auVar63._28_4_ = DAT_0205d4a0._28_4_;
    auVar95 = vfnmadd231ps_fma(auVar63,auVar310,auVar325);
    auVar46._4_4_ = local_138._4_4_ * fVar216;
    auVar46._0_4_ = local_138._0_4_ * fVar197;
    auVar46._8_4_ = local_138._8_4_ * fVar215;
    auVar46._12_4_ = local_138._12_4_ * fVar218;
    auVar46._16_4_ = local_138._16_4_ * fVar219;
    auVar46._20_4_ = local_138._20_4_ * fVar220;
    auVar46._24_4_ = local_138._24_4_ * fVar221;
    auVar46._28_4_ = auVar29._28_4_;
    auVar119 = vfnmadd231ps_fma(auVar46,local_f8,auVar325);
    auVar47._4_4_ = local_118._4_4_ * fVar216;
    auVar47._0_4_ = local_118._0_4_ * fVar197;
    auVar47._8_4_ = local_118._8_4_ * fVar215;
    auVar47._12_4_ = local_118._12_4_ * fVar218;
    auVar47._16_4_ = local_118._16_4_ * fVar219;
    auVar47._20_4_ = local_118._20_4_ * fVar220;
    auVar47._24_4_ = local_118._24_4_ * fVar221;
    auVar47._28_4_ = local_d8._28_4_;
    auVar251 = vfnmadd231ps_fma(auVar47,auVar325,auVar32);
    auVar48._4_4_ = local_78._4_4_ * fVar216;
    auVar48._0_4_ = local_78._0_4_ * fVar197;
    auVar48._8_4_ = local_78._8_4_ * fVar215;
    auVar48._12_4_ = local_78._12_4_ * fVar218;
    auVar48._16_4_ = local_78._16_4_ * fVar219;
    auVar48._20_4_ = local_78._20_4_ * fVar220;
    auVar48._24_4_ = local_78._24_4_ * fVar221;
    auVar48._28_4_ = auVar92._28_4_ + auVar27._28_4_;
    auVar120 = vfnmadd231ps_fma(auVar48,auVar325,auVar31);
    auVar25 = vminps_avx(ZEXT1632(auVar81),ZEXT1632(auVar82));
    auVar92 = vmaxps_avx(ZEXT1632(auVar81),ZEXT1632(auVar82));
    auVar26 = vminps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
    auVar26 = vminps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
    auVar92 = vmaxps_avx(auVar92,auVar25);
    auVar27 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar119));
    auVar25 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar119));
    auVar28 = vminps_avx(ZEXT1632(auVar251),ZEXT1632(auVar120));
    auVar27 = vminps_avx(auVar27,auVar28);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(ZEXT1632(auVar251),ZEXT1632(auVar120));
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(auVar92,auVar25);
    auVar62._4_4_ = fStack_194;
    auVar62._0_4_ = local_198;
    auVar62._8_4_ = fStack_190;
    auVar62._12_4_ = fStack_18c;
    auVar62._16_4_ = fStack_188;
    auVar62._20_4_ = fStack_184;
    auVar62._24_4_ = fStack_180;
    auVar62._28_4_ = fStack_17c;
    auVar92 = vcmpps_avx(auVar27,auVar62,2);
    auVar61._4_4_ = fStack_1b4;
    auVar61._0_4_ = local_1b8;
    auVar61._8_4_ = fStack_1b0;
    auVar61._12_4_ = fStack_1ac;
    auVar61._16_4_ = fStack_1a8;
    auVar61._20_4_ = fStack_1a4;
    auVar61._24_4_ = fStack_1a0;
    auVar61._28_4_ = fStack_19c;
    auVar25 = vcmpps_avx(auVar25,auVar61,5);
    auVar92 = vandps_avx(auVar25,auVar92);
    auVar25 = local_288 & auVar92;
    uVar67 = 0;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar25 = vsubps_avx(auVar29,local_98);
      auVar26 = vsubps_avx(auVar31,auVar310);
      fVar155 = auVar25._0_4_ + auVar26._0_4_;
      fVar156 = auVar25._4_4_ + auVar26._4_4_;
      fVar197 = auVar25._8_4_ + auVar26._8_4_;
      fVar216 = auVar25._12_4_ + auVar26._12_4_;
      fVar215 = auVar25._16_4_ + auVar26._16_4_;
      fVar218 = auVar25._20_4_ + auVar26._20_4_;
      fVar219 = auVar25._24_4_ + auVar26._24_4_;
      auVar27 = vsubps_avx(auVar30,local_b8);
      auVar28 = vsubps_avx(local_78,ZEXT1632(auVar101));
      auVar116._0_4_ = auVar27._0_4_ + auVar28._0_4_;
      auVar116._4_4_ = auVar27._4_4_ + auVar28._4_4_;
      auVar116._8_4_ = auVar27._8_4_ + auVar28._8_4_;
      auVar116._12_4_ = auVar27._12_4_ + auVar28._12_4_;
      auVar116._16_4_ = auVar27._16_4_ + auVar28._16_4_;
      auVar116._20_4_ = auVar27._20_4_ + auVar28._20_4_;
      auVar116._24_4_ = auVar27._24_4_ + auVar28._24_4_;
      fVar154 = auVar28._28_4_;
      auVar116._28_4_ = auVar27._28_4_ + fVar154;
      auVar335._0_4_ = fVar137 * fVar155;
      auVar335._4_4_ = fVar118 * fVar156;
      auVar335._8_4_ = fVar133 * fVar197;
      auVar335._12_4_ = fVar134 * fVar216;
      auVar335._16_4_ = fVar215 * 0.0;
      auVar335._20_4_ = fVar218 * 0.0;
      auVar335._24_4_ = fVar219 * 0.0;
      auVar335._28_4_ = 0;
      auVar95 = vfnmadd231ps_fma(auVar335,auVar116,local_98);
      auVar49._4_4_ = fVar156 * fStack_154;
      auVar49._0_4_ = fVar155 * local_158;
      auVar49._8_4_ = fVar197 * fStack_150;
      auVar49._12_4_ = fVar216 * fStack_14c;
      auVar49._16_4_ = fVar215 * fStack_148;
      auVar49._20_4_ = fVar218 * fStack_144;
      auVar49._24_4_ = fVar219 * fStack_140;
      auVar49._28_4_ = fVar154;
      auVar58._4_4_ = fVar284;
      auVar58._0_4_ = fVar272;
      auVar58._8_4_ = fVar196;
      auVar58._12_4_ = fVar217;
      auVar58._16_4_ = fVar285;
      auVar58._20_4_ = fVar286;
      auVar58._24_4_ = fVar287;
      auVar58._28_4_ = 0x40400000;
      auVar81 = vfnmadd213ps_fma(auVar58,auVar116,auVar49);
      auVar50._4_4_ = fVar156 * local_178._4_4_;
      auVar50._0_4_ = fVar155 * local_178._0_4_;
      auVar50._8_4_ = fVar197 * local_178._8_4_;
      auVar50._12_4_ = fVar216 * local_178._12_4_;
      auVar50._16_4_ = fVar215 * local_178._16_4_;
      auVar50._20_4_ = fVar218 * local_178._20_4_;
      auVar50._24_4_ = fVar219 * local_178._24_4_;
      auVar50._28_4_ = fVar154;
      auVar82 = vfnmadd213ps_fma(local_d8,auVar116,auVar50);
      auVar51._4_4_ = (float)local_5e8._4_4_ * fVar156;
      auVar51._0_4_ = (float)local_5e8._0_4_ * fVar155;
      auVar51._8_4_ = (float)uStack_5e0 * fVar197;
      auVar51._12_4_ = uStack_5e0._4_4_ * fVar216;
      auVar51._16_4_ = (float)uStack_5d8 * fVar215;
      auVar51._20_4_ = uStack_5d8._4_4_ * fVar218;
      auVar51._24_4_ = (float)uStack_5d0 * fVar219;
      auVar51._28_4_ = fVar154;
      auVar101 = vfnmadd231ps_fma(auVar51,auVar116,auVar29);
      auVar131._0_4_ = fVar178 * fVar155;
      auVar131._4_4_ = fVar194 * fVar156;
      auVar131._8_4_ = fVar138 * fVar197;
      auVar131._12_4_ = fVar195 * fVar216;
      auVar131._16_4_ = fVar215 * 0.0;
      auVar131._20_4_ = fVar218 * 0.0;
      auVar131._24_4_ = fVar219 * 0.0;
      auVar131._28_4_ = 0;
      auVar119 = vfnmadd231ps_fma(auVar131,auVar116,auVar310);
      auVar52._4_4_ = fVar156 * local_138._4_4_;
      auVar52._0_4_ = fVar155 * local_138._0_4_;
      auVar52._8_4_ = fVar197 * local_138._8_4_;
      auVar52._12_4_ = fVar216 * local_138._12_4_;
      auVar52._16_4_ = fVar215 * local_138._16_4_;
      auVar52._20_4_ = fVar218 * local_138._20_4_;
      auVar52._24_4_ = fVar219 * local_138._24_4_;
      auVar52._28_4_ = auVar30._28_4_;
      auVar79 = vfnmadd213ps_fma(local_f8,auVar116,auVar52);
      auVar53._4_4_ = fVar156 * local_118._4_4_;
      auVar53._0_4_ = fVar155 * local_118._0_4_;
      auVar53._8_4_ = fVar197 * local_118._8_4_;
      auVar53._12_4_ = fVar216 * local_118._12_4_;
      auVar53._16_4_ = fVar215 * local_118._16_4_;
      auVar53._20_4_ = fVar218 * local_118._20_4_;
      auVar53._24_4_ = fVar219 * local_118._24_4_;
      auVar53._28_4_ = auVar30._28_4_;
      auVar80 = vfnmadd213ps_fma(auVar32,auVar116,auVar53);
      auVar54._4_4_ = local_78._4_4_ * fVar156;
      auVar54._0_4_ = local_78._0_4_ * fVar155;
      auVar54._8_4_ = local_78._8_4_ * fVar197;
      auVar54._12_4_ = local_78._12_4_ * fVar216;
      auVar54._16_4_ = local_78._16_4_ * fVar215;
      auVar54._20_4_ = local_78._20_4_ * fVar218;
      auVar54._24_4_ = local_78._24_4_ * fVar219;
      auVar54._28_4_ = auVar25._28_4_ + auVar26._28_4_;
      auVar251 = vfnmadd231ps_fma(auVar54,auVar116,auVar31);
      auVar26 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar81));
      auVar25 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar81));
      auVar27 = vminps_avx(ZEXT1632(auVar82),ZEXT1632(auVar101));
      auVar27 = vminps_avx(auVar26,auVar27);
      auVar26 = vmaxps_avx(ZEXT1632(auVar82),ZEXT1632(auVar101));
      auVar25 = vmaxps_avx(auVar25,auVar26);
      auVar28 = vminps_avx(ZEXT1632(auVar119),ZEXT1632(auVar79));
      auVar26 = vmaxps_avx(ZEXT1632(auVar119),ZEXT1632(auVar79));
      auVar29 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar251));
      auVar28 = vminps_avx(auVar28,auVar29);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar251));
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar26 = vmaxps_avx(auVar25,auVar26);
      auVar25 = vcmpps_avx(auVar28,auVar62,2);
      auVar26 = vcmpps_avx(auVar26,auVar61,5);
      auVar25 = vandps_avx(auVar26,auVar25);
      auVar92 = vandps_avx(auVar92,local_288);
      auVar26 = auVar92 & auVar25;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar25,auVar92);
        uVar67 = vmovmskps_avx(auVar92);
      }
    }
    if (uVar67 != 0) {
      auStack_388[uVar70] = uVar67;
      uVar198 = vmovlps_avx(local_308);
      *(undefined8 *)(&uStack_268 + uVar70 * 2) = uVar198;
      uVar75 = vmovlps_avx(_local_668);
      auStack_58[uVar70] = uVar75;
      uVar70 = (ulong)((int)uVar70 + 1);
    }
    do {
      if ((int)uVar70 == 0) {
        uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar91._4_4_ = uVar78;
        auVar91._0_4_ = uVar78;
        auVar91._8_4_ = uVar78;
        auVar91._12_4_ = uVar78;
        auVar15 = vcmpps_avx(local_358,auVar91,2);
        uVar69 = vmovmskps_avx(auVar15);
        uVar66 = uVar66 & uVar66 + 0xf & uVar69;
        if (uVar66 == 0) {
          return;
        }
        goto LAB_0178c938;
      }
      uVar68 = (int)uVar70 - 1;
      uVar71 = (ulong)uVar68;
      uVar74 = auStack_388[uVar71];
      uVar67 = (&uStack_268)[uVar71 * 2];
      fVar178 = afStack_264[uVar71 * 2];
      iVar33 = 0;
      for (uVar75 = (ulong)uVar74; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
        iVar33 = iVar33 + 1;
      }
      uVar74 = uVar74 - 1 & uVar74;
      if (uVar74 == 0) {
        uVar70 = (ulong)uVar68;
      }
      register0x00001348 = 0;
      local_668 = auStack_58[uVar71];
      auStack_388[uVar71] = uVar74;
      fVar194 = (float)(iVar33 + 1) * 0.14285715;
      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * (float)iVar33 * 0.14285715)),
                                ZEXT416(uVar67),ZEXT416((uint)(1.0 - (float)iVar33 * 0.14285715)));
      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar194)),ZEXT416(uVar67),
                                ZEXT416((uint)(1.0 - fVar194)));
      auVar214._0_4_ = auVar81._0_4_;
      fVar194 = auVar82._0_4_;
      fVar178 = fVar194 - auVar214._0_4_;
      if (0.16666667 <= fVar178) break;
      auVar79 = vshufps_avx(_local_668,_local_668,0x50);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = &DAT_3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar80 = vsubps_avx(auVar124,auVar79);
      fVar138 = auVar79._0_4_;
      auVar146._0_4_ = fVar138 * fVar135;
      fVar195 = auVar79._4_4_;
      auVar146._4_4_ = fVar195 * fVar136;
      fVar137 = auVar79._8_4_;
      auVar146._8_4_ = fVar137 * fVar135;
      fVar118 = auVar79._12_4_;
      auVar146._12_4_ = fVar118 * fVar136;
      auVar166._0_4_ = fVar138 * fVar222;
      auVar166._4_4_ = fVar195 * fVar239;
      auVar166._8_4_ = fVar137 * fVar222;
      auVar166._12_4_ = fVar118 * fVar239;
      auVar187._0_4_ = fVar138 * fVar260;
      auVar187._4_4_ = fVar195 * fVar271;
      auVar187._8_4_ = fVar137 * fVar260;
      auVar187._12_4_ = fVar118 * fVar271;
      auVar107._0_4_ = fVar138 * fVar326;
      auVar107._4_4_ = fVar195 * fVar336;
      auVar107._8_4_ = fVar137 * fVar326;
      auVar107._12_4_ = fVar118 * fVar336;
      auVar79 = vfmadd231ps_fma(auVar146,auVar80,auVar208);
      auVar95 = vfmadd231ps_fma(auVar166,auVar80,auVar248);
      auVar101 = vfmadd231ps_fma(auVar187,auVar80,auVar275);
      auVar80 = vfmadd231ps_fma(auVar107,auVar80,auVar315);
      auVar132._16_16_ = auVar79;
      auVar132._0_16_ = auVar79;
      auVar152._16_16_ = auVar95;
      auVar152._0_16_ = auVar95;
      auVar177._16_16_ = auVar101;
      auVar177._0_16_ = auVar101;
      auVar214._4_4_ = auVar214._0_4_;
      auVar214._8_4_ = auVar214._0_4_;
      auVar214._12_4_ = auVar214._0_4_;
      auVar214._20_4_ = fVar194;
      auVar214._16_4_ = fVar194;
      auVar214._24_4_ = fVar194;
      auVar214._28_4_ = fVar194;
      auVar92 = vsubps_avx(auVar152,auVar132);
      auVar95 = vfmadd213ps_fma(auVar92,auVar214,auVar132);
      auVar92 = vsubps_avx(auVar177,auVar152);
      auVar119 = vfmadd213ps_fma(auVar92,auVar214,auVar152);
      auVar79 = vsubps_avx(auVar80,auVar101);
      auVar153._16_16_ = auVar79;
      auVar153._0_16_ = auVar79;
      auVar79 = vfmadd213ps_fma(auVar153,auVar214,auVar177);
      auVar92 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar95));
      auVar80 = vfmadd213ps_fma(auVar92,auVar214,ZEXT1632(auVar95));
      auVar92 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar119));
      auVar79 = vfmadd213ps_fma(auVar92,auVar214,ZEXT1632(auVar119));
      auVar92 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
      auVar157 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar92,auVar214);
      fVar134 = auVar92._4_4_ * 3.0;
      fVar133 = fVar178 * 0.33333334;
      auVar276._0_8_ =
           CONCAT44(auVar157._4_4_ + fVar133 * fVar134,
                    auVar157._0_4_ + fVar133 * auVar92._0_4_ * 3.0);
      auVar276._8_4_ = auVar157._8_4_ + fVar133 * auVar92._8_4_ * 3.0;
      auVar276._12_4_ = auVar157._12_4_ + fVar133 * auVar92._12_4_ * 3.0;
      auVar80 = vshufpd_avx(auVar157,auVar157,3);
      auVar95 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar79 = vsubps_avx(auVar80,auVar157);
      auVar101 = vsubps_avx(auVar95,(undefined1  [16])0x0);
      auVar125._0_4_ = auVar79._0_4_ + auVar101._0_4_;
      auVar125._4_4_ = auVar79._4_4_ + auVar101._4_4_;
      auVar125._8_4_ = auVar79._8_4_ + auVar101._8_4_;
      auVar125._12_4_ = auVar79._12_4_ + auVar101._12_4_;
      auVar79 = vshufps_avx(auVar157,auVar157,0xb1);
      auVar101 = vshufps_avx(auVar276,auVar276,0xb1);
      auVar316._4_4_ = auVar125._0_4_;
      auVar316._0_4_ = auVar125._0_4_;
      auVar316._8_4_ = auVar125._0_4_;
      auVar316._12_4_ = auVar125._0_4_;
      auVar119 = vshufps_avx(auVar125,auVar125,0x55);
      fVar138 = auVar119._0_4_;
      auVar229._0_4_ = auVar79._0_4_ * fVar138;
      fVar195 = auVar119._4_4_;
      auVar229._4_4_ = auVar79._4_4_ * fVar195;
      fVar137 = auVar119._8_4_;
      auVar229._8_4_ = auVar79._8_4_ * fVar137;
      fVar118 = auVar119._12_4_;
      auVar229._12_4_ = auVar79._12_4_ * fVar118;
      auVar249._0_4_ = auVar101._0_4_ * fVar138;
      auVar249._4_4_ = auVar101._4_4_ * fVar195;
      auVar249._8_4_ = auVar101._8_4_ * fVar137;
      auVar249._12_4_ = auVar101._12_4_ * fVar118;
      auVar251 = vfmadd231ps_fma(auVar229,auVar316,auVar157);
      auVar120 = vfmadd231ps_fma(auVar249,auVar316,auVar276);
      auVar101 = vshufps_avx(auVar251,auVar251,0xe8);
      auVar119 = vshufps_avx(auVar120,auVar120,0xe8);
      auVar79 = vcmpps_avx(auVar101,auVar119,1);
      uVar67 = vextractps_avx(auVar79,0);
      auVar179 = auVar120;
      if ((uVar67 & 1) == 0) {
        auVar179 = auVar251;
      }
      auVar167._0_4_ = fVar133 * auVar92._16_4_ * 3.0;
      auVar167._4_4_ = fVar133 * fVar134;
      auVar167._8_4_ = fVar133 * auVar92._24_4_ * 3.0;
      auVar167._12_4_ = fVar133 * fVar194;
      auVar224 = vsubps_avx((undefined1  [16])0x0,auVar167);
      auVar168 = vshufps_avx(auVar224,auVar224,0xb1);
      auVar189 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar341._0_4_ = auVar168._0_4_ * fVar138;
      auVar341._4_4_ = auVar168._4_4_ * fVar195;
      auVar341._8_4_ = auVar168._8_4_ * fVar137;
      auVar341._12_4_ = auVar168._12_4_ * fVar118;
      auVar126._0_4_ = auVar189._0_4_ * fVar138;
      auVar126._4_4_ = auVar189._4_4_ * fVar195;
      auVar126._8_4_ = auVar189._8_4_ * fVar137;
      auVar126._12_4_ = auVar189._12_4_ * fVar118;
      auVar240 = vfmadd231ps_fma(auVar341,auVar316,auVar224);
      auVar241 = vfmadd231ps_fma(auVar126,(undefined1  [16])0x0,auVar316);
      auVar189 = vshufps_avx(auVar240,auVar240,0xe8);
      auVar223 = vshufps_avx(auVar241,auVar241,0xe8);
      auVar168 = vcmpps_avx(auVar189,auVar223,1);
      uVar67 = vextractps_avx(auVar168,0);
      auVar261 = auVar241;
      if ((uVar67 & 1) == 0) {
        auVar261 = auVar240;
      }
      auVar179 = vmaxss_avx(auVar261,auVar179);
      auVar101 = vminps_avx(auVar101,auVar119);
      auVar119 = vminps_avx(auVar189,auVar223);
      auVar119 = vminps_avx(auVar101,auVar119);
      auVar79 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vblendps_avx(auVar79,auVar168,2);
      auVar168 = vpslld_avx(auVar79,0x1f);
      auVar79 = vshufpd_avx(auVar120,auVar120,1);
      auVar79 = vinsertps_avx(auVar79,auVar241,0x9c);
      auVar101 = vshufpd_avx(auVar251,auVar251,1);
      auVar101 = vinsertps_avx(auVar101,auVar240,0x9c);
      auVar79 = vblendvps_avx(auVar101,auVar79,auVar168);
      auVar101 = vmovshdup_avx(auVar79);
      auVar79 = vmaxss_avx(auVar101,auVar79);
      fVar137 = auVar119._0_4_;
      auVar101 = vmovshdup_avx(auVar119);
      fVar195 = auVar79._0_4_;
      fVar138 = auVar179._0_4_;
      if ((0.0001 <= fVar137) || (fVar195 <= -0.0001)) {
        auVar251 = vcmpps_avx(auVar101,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar120 = vcmpps_avx(auVar119,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar251 = vorps_avx(auVar120,auVar251);
        if ((-0.0001 < fVar138 & auVar251[0]) != 0) goto LAB_0178dee0;
        auVar251 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar79,5);
        auVar120 = vcmpps_avx(auVar101,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar251 = vorps_avx(auVar120,auVar251);
        if ((auVar251 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0178dee0;
LAB_0178e87b:
        bVar55 = true;
      }
      else {
LAB_0178dee0:
        auVar120 = vcmpps_avx(auVar119,_DAT_01feba10,1);
        auVar168 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar251 = vcmpss_avx(auVar179,ZEXT816(0) << 0x20,1);
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = &DAT_3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar250._8_4_ = 0xbf800000;
        auVar250._0_8_ = 0xbf800000bf800000;
        auVar250._12_4_ = 0xbf800000;
        auVar251 = vblendvps_avx(auVar188,auVar250,auVar251);
        auVar120 = vblendvps_avx(auVar188,auVar250,auVar120);
        fVar118 = auVar120._0_4_;
        fVar133 = auVar251._0_4_;
        auVar251 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar118 == fVar133) && (!NAN(fVar118) && !NAN(fVar133))) {
          auVar251 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar189 = ZEXT816(0) << 0x20;
        if ((fVar118 == fVar133) && (!NAN(fVar118) && !NAN(fVar133))) {
          auVar168 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar120 = vmovshdup_avx(auVar120);
        fVar134 = auVar120._0_4_;
        if ((fVar118 != fVar134) || (NAN(fVar118) || NAN(fVar134))) {
          fVar118 = auVar101._0_4_;
          if ((fVar118 != fVar137) || (NAN(fVar118) || NAN(fVar137))) {
            auVar127._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
            auVar127._8_4_ = auVar119._8_4_ ^ 0x80000000;
            auVar127._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar169._0_4_ = -fVar137 / (fVar118 - fVar137);
            auVar169._4_12_ = auVar127._4_12_;
            auVar101 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar169._0_4_)),auVar189,auVar169);
            auVar119 = auVar101;
          }
          else {
            auVar101 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar137 == 0.0) && (auVar101 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar137))) {
              auVar101 = ZEXT816(0);
            }
            auVar119 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar137 == 0.0) && (auVar119 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar137))) {
              auVar119 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar251 = vminss_avx(auVar251,auVar101);
          auVar168 = vmaxss_avx(auVar119,auVar168);
        }
        auVar79 = vcmpss_avx(auVar79,auVar189,1);
        auVar170._8_4_ = 0x3f800000;
        auVar170._0_8_ = &DAT_3f8000003f800000;
        auVar170._12_4_ = 0x3f800000;
        auVar302._8_4_ = 0xbf800000;
        auVar302._0_8_ = 0xbf800000bf800000;
        auVar302._12_4_ = 0xbf800000;
        auVar79 = vblendvps_avx(auVar170,auVar302,auVar79);
        fVar137 = auVar79._0_4_;
        auVar79 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar133 != fVar137) || (NAN(fVar133) || NAN(fVar137))) {
          if ((fVar195 != fVar138) || (NAN(fVar195) || NAN(fVar138))) {
            auVar128._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
            auVar128._8_4_ = auVar179._8_4_ ^ 0x80000000;
            auVar128._12_4_ = auVar179._12_4_ ^ 0x80000000;
            auVar171._0_4_ = -fVar138 / (fVar195 - fVar138);
            auVar171._4_12_ = auVar128._4_12_;
            auVar101 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar171._0_4_)),auVar189,auVar171);
            auVar119 = auVar101;
          }
          else {
            auVar101 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar138 == 0.0) && (auVar101 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar138))) {
              auVar101 = ZEXT816(0);
            }
            auVar119 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar138 == 0.0) && (auVar119 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar138))) {
              auVar119 = auVar79;
            }
          }
          auVar251 = vminss_avx(auVar251,auVar101);
          auVar168 = vmaxss_avx(auVar119,auVar168);
        }
        if ((fVar134 != fVar137) || (NAN(fVar134) || NAN(fVar137))) {
          auVar251 = vminss_avx(auVar251,auVar79);
          auVar168 = vmaxss_avx(auVar79,auVar168);
        }
        auVar101 = vmaxss_avx(auVar189,auVar251);
        auVar119 = vminss_avx(auVar168,auVar79);
        bVar55 = true;
        if (auVar101._0_4_ <= auVar119._0_4_) {
          auVar101 = vmaxss_avx(auVar189,ZEXT416((uint)(auVar101._0_4_ + -0.1)));
          auVar79 = vminss_avx(ZEXT416((uint)(auVar119._0_4_ + 0.1)),auVar79);
          auVar108._0_8_ = auVar157._0_8_;
          auVar108._8_8_ = auVar108._0_8_;
          auVar252._8_8_ = auVar276._0_8_;
          auVar252._0_8_ = auVar276._0_8_;
          auVar266._8_8_ = auVar224._0_8_;
          auVar266._0_8_ = auVar224._0_8_;
          auVar119 = vshufpd_avx(auVar276,auVar276,3);
          auVar251 = vshufpd_avx(auVar224,auVar224,3);
          auVar120 = vshufps_avx(auVar101,auVar79,0);
          auVar147._8_4_ = 0x3f800000;
          auVar147._0_8_ = &DAT_3f8000003f800000;
          auVar147._12_4_ = 0x3f800000;
          auVar157 = vsubps_avx(auVar147,auVar120);
          local_648._0_4_ = auVar80._0_4_;
          local_648._4_4_ = auVar80._4_4_;
          fStack_640 = auVar80._8_4_;
          fStack_63c = auVar80._12_4_;
          fVar138 = auVar120._0_4_;
          auVar148._0_4_ = fVar138 * (float)local_648._0_4_;
          fVar195 = auVar120._4_4_;
          auVar148._4_4_ = fVar195 * (float)local_648._4_4_;
          fVar137 = auVar120._8_4_;
          auVar148._8_4_ = fVar137 * fStack_640;
          fVar118 = auVar120._12_4_;
          auVar148._12_4_ = fVar118 * fStack_63c;
          auVar172._0_4_ = auVar119._0_4_ * fVar138;
          auVar172._4_4_ = auVar119._4_4_ * fVar195;
          auVar172._8_4_ = auVar119._8_4_ * fVar137;
          auVar172._12_4_ = auVar119._12_4_ * fVar118;
          auVar190._0_4_ = auVar251._0_4_ * fVar138;
          auVar190._4_4_ = auVar251._4_4_ * fVar195;
          auVar190._8_4_ = auVar251._8_4_ * fVar137;
          auVar190._12_4_ = auVar251._12_4_ * fVar118;
          local_5e8._0_4_ = auVar95._0_4_;
          local_5e8._4_4_ = auVar95._4_4_;
          uStack_5e0._0_4_ = auVar95._8_4_;
          uStack_5e0._4_4_ = auVar95._12_4_;
          auVar209._0_4_ = fVar138 * (float)local_5e8._0_4_;
          auVar209._4_4_ = fVar195 * (float)local_5e8._4_4_;
          auVar209._8_4_ = fVar137 * (float)uStack_5e0;
          auVar209._12_4_ = fVar118 * uStack_5e0._4_4_;
          auVar119 = vfmadd231ps_fma(auVar148,auVar157,auVar108);
          auVar251 = vfmadd231ps_fma(auVar172,auVar157,auVar252);
          auVar120 = vfmadd231ps_fma(auVar190,auVar157,auVar266);
          auVar157 = vfmadd231ps_fma(auVar209,auVar157,ZEXT816(0));
          auVar80 = vmovshdup_avx(_local_668);
          auVar189 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar101._0_4_)),_local_668,
                                     ZEXT416((uint)(1.0 - auVar101._0_4_)));
          auVar223 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar79._0_4_)),_local_668,
                                     ZEXT416((uint)(1.0 - auVar79._0_4_)));
          fVar138 = 1.0 / fVar178;
          auVar79 = vsubps_avx(auVar251,auVar119);
          auVar230._0_4_ = auVar79._0_4_ * 3.0;
          auVar230._4_4_ = auVar79._4_4_ * 3.0;
          auVar230._8_4_ = auVar79._8_4_ * 3.0;
          auVar230._12_4_ = auVar79._12_4_ * 3.0;
          auVar79 = vsubps_avx(auVar120,auVar251);
          auVar253._0_4_ = auVar79._0_4_ * 3.0;
          auVar253._4_4_ = auVar79._4_4_ * 3.0;
          auVar253._8_4_ = auVar79._8_4_ * 3.0;
          auVar253._12_4_ = auVar79._12_4_ * 3.0;
          auVar79 = vsubps_avx(auVar157,auVar120);
          auVar267._0_4_ = auVar79._0_4_ * 3.0;
          auVar267._4_4_ = auVar79._4_4_ * 3.0;
          auVar267._8_4_ = auVar79._8_4_ * 3.0;
          auVar267._12_4_ = auVar79._12_4_ * 3.0;
          auVar80 = vminps_avx(auVar253,auVar267);
          auVar79 = vmaxps_avx(auVar253,auVar267);
          auVar80 = vminps_avx(auVar230,auVar80);
          auVar79 = vmaxps_avx(auVar230,auVar79);
          auVar95 = vshufpd_avx(auVar80,auVar80,3);
          auVar101 = vshufpd_avx(auVar79,auVar79,3);
          auVar80 = vminps_avx(auVar80,auVar95);
          auVar79 = vmaxps_avx(auVar79,auVar101);
          auVar254._0_4_ = auVar80._0_4_ * fVar138;
          auVar254._4_4_ = auVar80._4_4_ * fVar138;
          auVar254._8_4_ = auVar80._8_4_ * fVar138;
          auVar254._12_4_ = auVar80._12_4_ * fVar138;
          auVar231._0_4_ = fVar138 * auVar79._0_4_;
          auVar231._4_4_ = fVar138 * auVar79._4_4_;
          auVar231._8_4_ = fVar138 * auVar79._8_4_;
          auVar231._12_4_ = fVar138 * auVar79._12_4_;
          fVar138 = 1.0 / (auVar223._0_4_ - auVar189._0_4_);
          auVar79 = vshufpd_avx(auVar119,auVar119,3);
          auVar80 = vshufpd_avx(auVar251,auVar251,3);
          auVar95 = vshufpd_avx(auVar120,auVar120,3);
          auVar101 = vshufpd_avx(auVar157,auVar157,3);
          auVar79 = vsubps_avx(auVar79,auVar119);
          auVar119 = vsubps_avx(auVar80,auVar251);
          auVar251 = vsubps_avx(auVar95,auVar120);
          auVar101 = vsubps_avx(auVar101,auVar157);
          auVar80 = vminps_avx(auVar79,auVar119);
          auVar79 = vmaxps_avx(auVar79,auVar119);
          auVar95 = vminps_avx(auVar251,auVar101);
          auVar95 = vminps_avx(auVar80,auVar95);
          auVar80 = vmaxps_avx(auVar251,auVar101);
          auVar79 = vmaxps_avx(auVar79,auVar80);
          auVar294._0_4_ = fVar138 * auVar95._0_4_;
          auVar294._4_4_ = fVar138 * auVar95._4_4_;
          auVar294._8_4_ = fVar138 * auVar95._8_4_;
          auVar294._12_4_ = fVar138 * auVar95._12_4_;
          auVar277._0_4_ = fVar138 * auVar79._0_4_;
          auVar277._4_4_ = fVar138 * auVar79._4_4_;
          auVar277._8_4_ = fVar138 * auVar79._8_4_;
          auVar277._12_4_ = fVar138 * auVar79._12_4_;
          auVar101 = vinsertps_avx(auVar81,auVar189,0x10);
          auVar119 = vinsertps_avx(auVar82,auVar223,0x10);
          auVar90._0_4_ = (auVar101._0_4_ + auVar119._0_4_) * 0.5;
          auVar90._4_4_ = (auVar101._4_4_ + auVar119._4_4_) * 0.5;
          auVar90._8_4_ = (auVar101._8_4_ + auVar119._8_4_) * 0.5;
          auVar90._12_4_ = (auVar101._12_4_ + auVar119._12_4_) * 0.5;
          auVar149._4_4_ = auVar90._0_4_;
          auVar149._0_4_ = auVar90._0_4_;
          auVar149._8_4_ = auVar90._0_4_;
          auVar149._12_4_ = auVar90._0_4_;
          auVar79 = vfmadd213ps_fma(auVar15,auVar149,auVar18);
          auVar80 = vfmadd213ps_fma(auVar16,auVar149,auVar19);
          auVar95 = vfmadd213ps_fma(auVar17,auVar149,auVar20);
          auVar82 = vsubps_avx(auVar80,auVar79);
          auVar79 = vfmadd213ps_fma(auVar82,auVar149,auVar79);
          auVar82 = vsubps_avx(auVar95,auVar80);
          auVar82 = vfmadd213ps_fma(auVar82,auVar149,auVar80);
          auVar82 = vsubps_avx(auVar82,auVar79);
          auVar79 = vfmadd231ps_fma(auVar79,auVar82,auVar149);
          auVar150._0_8_ = CONCAT44(auVar82._4_4_ * 3.0,auVar82._0_4_ * 3.0);
          auVar150._8_4_ = auVar82._8_4_ * 3.0;
          auVar150._12_4_ = auVar82._12_4_ * 3.0;
          auVar268._8_8_ = auVar79._0_8_;
          auVar268._0_8_ = auVar79._0_8_;
          auVar82 = vshufpd_avx(auVar79,auVar79,3);
          auVar79 = vshufps_avx(auVar90,auVar90,0x55);
          auVar251 = vsubps_avx(auVar82,auVar268);
          auVar157 = vfmadd231ps_fma(auVar268,auVar79,auVar251);
          auVar317._8_8_ = auVar150._0_8_;
          auVar317._0_8_ = auVar150._0_8_;
          auVar82 = vshufpd_avx(auVar150,auVar150,3);
          auVar82 = vsubps_avx(auVar82,auVar317);
          auVar120 = vfmadd213ps_fma(auVar82,auVar79,auVar317);
          auVar79 = vmovshdup_avx(auVar120);
          auVar318._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
          auVar318._8_4_ = auVar79._8_4_ ^ 0x80000000;
          auVar318._12_4_ = auVar79._12_4_ ^ 0x80000000;
          auVar80 = vmovshdup_avx(auVar251);
          auVar82 = vunpcklps_avx(auVar80,auVar318);
          auVar95 = vshufps_avx(auVar82,auVar318,4);
          auVar342._0_8_ = auVar251._0_8_ ^ 0x8000000080000000;
          auVar342._8_4_ = auVar251._8_4_ ^ 0x80000000;
          auVar342._12_4_ = auVar251._12_4_ ^ 0x80000000;
          auVar82 = vmovlhps_avx(auVar342,auVar120);
          auVar82 = vshufps_avx(auVar82,auVar120,8);
          auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar251._0_4_)),auVar80,auVar120
                                   );
          auVar173._0_4_ = auVar79._0_4_;
          auVar173._4_4_ = auVar173._0_4_;
          auVar173._8_4_ = auVar173._0_4_;
          auVar173._12_4_ = auVar173._0_4_;
          auVar79 = vdivps_avx(auVar95,auVar173);
          auVar80 = vdivps_avx(auVar82,auVar173);
          fVar137 = auVar157._0_4_;
          fVar138 = auVar79._0_4_;
          auVar82 = vshufps_avx(auVar157,auVar157,0x55);
          fVar195 = auVar80._0_4_;
          local_5e8._4_4_ = fVar137 * auVar79._4_4_ + auVar82._4_4_ * auVar80._4_4_;
          local_5e8._0_4_ = fVar137 * fVar138 + auVar82._0_4_ * fVar195;
          uStack_5e0._0_4_ = fVar137 * auVar79._8_4_ + auVar82._8_4_ * auVar80._8_4_;
          uStack_5e0._4_4_ = fVar137 * auVar79._12_4_ + auVar82._12_4_ * auVar80._12_4_;
          auVar251 = vmovshdup_avx(auVar79);
          auVar82 = vinsertps_avx(auVar254,auVar294,0x1c);
          auVar332._0_4_ = auVar251._0_4_ * auVar82._0_4_;
          auVar332._4_4_ = auVar251._4_4_ * auVar82._4_4_;
          auVar332._8_4_ = auVar251._8_4_ * auVar82._8_4_;
          auVar332._12_4_ = auVar251._12_4_ * auVar82._12_4_;
          auVar95 = vinsertps_avx(auVar231,auVar277,0x1c);
          auVar303._0_4_ = auVar251._0_4_ * auVar95._0_4_;
          auVar303._4_4_ = auVar251._4_4_ * auVar95._4_4_;
          auVar303._8_4_ = auVar251._8_4_ * auVar95._8_4_;
          auVar303._12_4_ = auVar251._12_4_ * auVar95._12_4_;
          auVar179 = vminps_avx(auVar332,auVar303);
          auVar157 = vmaxps_avx(auVar303,auVar332);
          auVar251 = vinsertps_avx(auVar294,auVar254,0x4c);
          auVar168 = vmovshdup_avx(auVar80);
          auVar120 = vinsertps_avx(auVar277,auVar231,0x4c);
          auVar278._0_4_ = auVar168._0_4_ * auVar251._0_4_;
          auVar278._4_4_ = auVar168._4_4_ * auVar251._4_4_;
          auVar278._8_4_ = auVar168._8_4_ * auVar251._8_4_;
          auVar278._12_4_ = auVar168._12_4_ * auVar251._12_4_;
          auVar295._0_4_ = auVar168._0_4_ * auVar120._0_4_;
          auVar295._4_4_ = auVar168._4_4_ * auVar120._4_4_;
          auVar295._8_4_ = auVar168._8_4_ * auVar120._8_4_;
          auVar295._12_4_ = auVar168._12_4_ * auVar120._12_4_;
          auVar168 = vminps_avx(auVar278,auVar295);
          auVar109._0_4_ = auVar168._0_4_ + auVar179._0_4_;
          auVar109._4_4_ = auVar168._4_4_ + auVar179._4_4_;
          auVar109._8_4_ = auVar168._8_4_ + auVar179._8_4_;
          auVar109._12_4_ = auVar168._12_4_ + auVar179._12_4_;
          auVar179 = vmaxps_avx(auVar295,auVar278);
          auVar279._0_4_ = auVar157._0_4_ + auVar179._0_4_;
          auVar279._4_4_ = auVar157._4_4_ + auVar179._4_4_;
          auVar279._8_4_ = auVar157._8_4_ + auVar179._8_4_;
          auVar279._12_4_ = auVar157._12_4_ + auVar179._12_4_;
          auVar296._8_8_ = 0x3f80000000000000;
          auVar296._0_8_ = 0x3f80000000000000;
          auVar157 = vsubps_avx(auVar296,auVar279);
          auVar179 = vsubps_avx(auVar296,auVar109);
          auVar168 = vsubps_avx(auVar101,auVar90);
          auVar319._0_4_ = fVar138 * auVar82._0_4_;
          auVar319._4_4_ = fVar138 * auVar82._4_4_;
          auVar319._8_4_ = fVar138 * auVar82._8_4_;
          auVar319._12_4_ = fVar138 * auVar82._12_4_;
          auVar304._0_4_ = fVar138 * auVar95._0_4_;
          auVar304._4_4_ = fVar138 * auVar95._4_4_;
          auVar304._8_4_ = fVar138 * auVar95._8_4_;
          auVar304._12_4_ = fVar138 * auVar95._12_4_;
          auVar95 = vminps_avx(auVar319,auVar304);
          auVar82 = vmaxps_avx(auVar304,auVar319);
          auVar255._0_4_ = fVar195 * auVar251._0_4_;
          auVar255._4_4_ = fVar195 * auVar251._4_4_;
          auVar255._8_4_ = fVar195 * auVar251._8_4_;
          auVar255._12_4_ = fVar195 * auVar251._12_4_;
          auVar232._0_4_ = fVar195 * auVar120._0_4_;
          auVar232._4_4_ = fVar195 * auVar120._4_4_;
          auVar232._8_4_ = fVar195 * auVar120._8_4_;
          auVar232._12_4_ = fVar195 * auVar120._12_4_;
          auVar251 = vminps_avx(auVar255,auVar232);
          auVar320._0_4_ = auVar95._0_4_ + auVar251._0_4_;
          auVar320._4_4_ = auVar95._4_4_ + auVar251._4_4_;
          auVar320._8_4_ = auVar95._8_4_ + auVar251._8_4_;
          auVar320._12_4_ = auVar95._12_4_ + auVar251._12_4_;
          auVar251 = vsubps_avx(auVar119,auVar90);
          auVar95 = vmaxps_avx(auVar232,auVar255);
          fVar137 = auVar168._0_4_;
          auVar256._0_4_ = fVar137 * auVar157._0_4_;
          fVar118 = auVar168._4_4_;
          auVar256._4_4_ = fVar118 * auVar157._4_4_;
          fVar133 = auVar168._8_4_;
          auVar256._8_4_ = fVar133 * auVar157._8_4_;
          fVar134 = auVar168._12_4_;
          auVar256._12_4_ = fVar134 * auVar157._12_4_;
          auVar233._0_4_ = auVar82._0_4_ + auVar95._0_4_;
          auVar233._4_4_ = auVar82._4_4_ + auVar95._4_4_;
          auVar233._8_4_ = auVar82._8_4_ + auVar95._8_4_;
          auVar233._12_4_ = auVar82._12_4_ + auVar95._12_4_;
          auVar305._8_8_ = 0x3f800000;
          auVar305._0_8_ = 0x3f800000;
          auVar82 = vsubps_avx(auVar305,auVar233);
          auVar95 = vsubps_avx(auVar305,auVar320);
          auVar321._0_4_ = fVar137 * auVar179._0_4_;
          auVar321._4_4_ = fVar118 * auVar179._4_4_;
          auVar321._8_4_ = fVar133 * auVar179._8_4_;
          auVar321._12_4_ = fVar134 * auVar179._12_4_;
          fVar154 = auVar251._0_4_;
          auVar280._0_4_ = fVar154 * auVar157._0_4_;
          fVar155 = auVar251._4_4_;
          auVar280._4_4_ = fVar155 * auVar157._4_4_;
          fVar156 = auVar251._8_4_;
          auVar280._8_4_ = fVar156 * auVar157._8_4_;
          fVar272 = auVar251._12_4_;
          auVar280._12_4_ = fVar272 * auVar157._12_4_;
          auVar110._0_4_ = fVar154 * auVar179._0_4_;
          auVar110._4_4_ = fVar155 * auVar179._4_4_;
          auVar110._8_4_ = fVar156 * auVar179._8_4_;
          auVar110._12_4_ = fVar272 * auVar179._12_4_;
          auVar343._0_4_ = fVar137 * auVar82._0_4_;
          auVar343._4_4_ = fVar118 * auVar82._4_4_;
          auVar343._8_4_ = fVar133 * auVar82._8_4_;
          auVar343._12_4_ = fVar134 * auVar82._12_4_;
          auVar297._0_4_ = fVar137 * auVar95._0_4_;
          auVar297._4_4_ = fVar118 * auVar95._4_4_;
          auVar297._8_4_ = fVar133 * auVar95._8_4_;
          auVar297._12_4_ = fVar134 * auVar95._12_4_;
          auVar234._0_4_ = fVar154 * auVar82._0_4_;
          auVar234._4_4_ = fVar155 * auVar82._4_4_;
          auVar234._8_4_ = fVar156 * auVar82._8_4_;
          auVar234._12_4_ = fVar272 * auVar82._12_4_;
          auVar306._0_4_ = fVar154 * auVar95._0_4_;
          auVar306._4_4_ = fVar155 * auVar95._4_4_;
          auVar306._8_4_ = fVar156 * auVar95._8_4_;
          auVar306._12_4_ = fVar272 * auVar95._12_4_;
          auVar82 = vminps_avx(auVar343,auVar297);
          auVar95 = vminps_avx(auVar234,auVar306);
          auVar82 = vminps_avx(auVar82,auVar95);
          auVar95 = vmaxps_avx(auVar297,auVar343);
          auVar251 = vminps_avx(auVar256,auVar321);
          auVar120 = vminps_avx(auVar280,auVar110);
          auVar251 = vminps_avx(auVar251,auVar120);
          auVar82 = vhaddps_avx(auVar82,auVar251);
          auVar251 = vmaxps_avx(auVar306,auVar234);
          auVar95 = vmaxps_avx(auVar251,auVar95);
          auVar251 = vmaxps_avx(auVar321,auVar256);
          auVar120 = vmaxps_avx(auVar110,auVar280);
          auVar251 = vmaxps_avx(auVar120,auVar251);
          auVar95 = vhaddps_avx(auVar95,auVar251);
          auVar251 = vshufps_avx(auVar90,auVar90,0x54);
          auVar251 = vsubps_avx(auVar251,_local_5e8);
          auVar82 = vshufps_avx(auVar82,auVar82,0xe8);
          auVar95 = vshufps_avx(auVar95,auVar95,0xe8);
          auVar257._0_4_ = auVar251._0_4_ + auVar82._0_4_;
          auVar257._4_4_ = auVar251._4_4_ + auVar82._4_4_;
          auVar257._8_4_ = auVar251._8_4_ + auVar82._8_4_;
          auVar257._12_4_ = auVar251._12_4_ + auVar82._12_4_;
          auVar235._0_4_ = auVar251._0_4_ + auVar95._0_4_;
          auVar235._4_4_ = auVar251._4_4_ + auVar95._4_4_;
          auVar235._8_4_ = auVar251._8_4_ + auVar95._8_4_;
          auVar235._12_4_ = auVar251._12_4_ + auVar95._12_4_;
          auVar82 = vmaxps_avx(auVar101,auVar257);
          auVar95 = vminps_avx(auVar235,auVar119);
          auVar82 = vcmpps_avx(auVar95,auVar82,1);
          auVar82 = vshufps_avx(auVar82,auVar82,0x50);
          _local_668 = vinsertps_avx(auVar189,ZEXT416((uint)auVar223._0_4_),0x10);
          if ((auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar82[0xf] < '\0') goto LAB_0178e87b;
          bVar73 = 0;
          if ((auVar214._0_4_ < auVar257._0_4_) && (bVar73 = 0, auVar235._0_4_ < auVar119._0_4_)) {
            auVar95 = vmovshdup_avx(auVar257);
            auVar82 = vcmpps_avx(auVar235,auVar119,1);
            bVar73 = auVar82[4] & auVar189._0_4_ < auVar95._0_4_;
          }
          if (((3 < (uint)uVar70 || fVar178 < 0.001) | bVar73) == 1) {
            lVar72 = 200;
            do {
              fVar133 = auVar251._0_4_;
              fVar118 = 1.0 - fVar133;
              fVar178 = fVar118 * fVar118 * fVar118;
              fVar137 = fVar133 * 3.0 * fVar118 * fVar118;
              fVar118 = fVar118 * fVar133 * fVar133 * 3.0;
              auVar191._4_4_ = fVar178;
              auVar191._0_4_ = fVar178;
              auVar191._8_4_ = fVar178;
              auVar191._12_4_ = fVar178;
              auVar129._4_4_ = fVar137;
              auVar129._0_4_ = fVar137;
              auVar129._8_4_ = fVar137;
              auVar129._12_4_ = fVar137;
              auVar111._4_4_ = fVar118;
              auVar111._0_4_ = fVar118;
              auVar111._8_4_ = fVar118;
              auVar111._12_4_ = fVar118;
              fVar133 = fVar133 * fVar133 * fVar133;
              auVar210._0_4_ = (float)local_398._0_4_ * fVar133;
              auVar210._4_4_ = (float)local_398._4_4_ * fVar133;
              auVar210._8_4_ = fStack_390 * fVar133;
              auVar210._12_4_ = fStack_38c * fVar133;
              auVar82 = vfmadd231ps_fma(auVar210,auVar20,auVar111);
              auVar82 = vfmadd231ps_fma(auVar82,auVar19,auVar129);
              auVar82 = vfmadd231ps_fma(auVar82,auVar18,auVar191);
              auVar112._8_8_ = auVar82._0_8_;
              auVar112._0_8_ = auVar82._0_8_;
              auVar82 = vshufpd_avx(auVar82,auVar82,3);
              auVar95 = vshufps_avx(auVar251,auVar251,0x55);
              auVar82 = vsubps_avx(auVar82,auVar112);
              auVar95 = vfmadd213ps_fma(auVar82,auVar95,auVar112);
              fVar178 = auVar95._0_4_;
              auVar82 = vshufps_avx(auVar95,auVar95,0x55);
              auVar113._0_4_ = fVar138 * fVar178 + fVar195 * auVar82._0_4_;
              auVar113._4_4_ = auVar79._4_4_ * fVar178 + auVar80._4_4_ * auVar82._4_4_;
              auVar113._8_4_ = auVar79._8_4_ * fVar178 + auVar80._8_4_ * auVar82._8_4_;
              auVar113._12_4_ = auVar79._12_4_ * fVar178 + auVar80._12_4_ * auVar82._12_4_;
              auVar251 = vsubps_avx(auVar251,auVar113);
              auVar82 = vandps_avx(auVar337,auVar95);
              auVar95 = vshufps_avx(auVar82,auVar82,0xf5);
              auVar82 = vmaxss_avx(auVar95,auVar82);
              if (auVar82._0_4_ < (float)local_298._0_4_) {
                local_218 = auVar251._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar82 = vmovshdup_avx(auVar251);
                  fVar178 = auVar82._0_4_;
                  if ((0.0 <= fVar178) && (fVar178 <= 1.0)) {
                    auVar82 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar157 = vinsertps_avx(auVar82,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar82 = vdpps_avx(auVar157,local_3a8,0x7f);
                    auVar79 = vdpps_avx(auVar157,local_3b8,0x7f);
                    auVar80 = vdpps_avx(auVar157,local_2a8,0x7f);
                    auVar95 = vdpps_avx(auVar157,local_2b8,0x7f);
                    auVar101 = vdpps_avx(auVar157,local_2c8,0x7f);
                    auVar119 = vdpps_avx(auVar157,local_2d8,0x7f);
                    auVar120 = vdpps_avx(auVar157,local_2e8,0x7f);
                    auVar157 = vdpps_avx(auVar157,local_2f8,0x7f);
                    fVar138 = 1.0 - fVar178;
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * auVar101._0_4_)),
                                              ZEXT416((uint)fVar138),auVar82);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(auVar119._0_4_ * fVar178)),
                                              ZEXT416((uint)fVar138),auVar79);
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar120._0_4_ * fVar178)),
                                              ZEXT416((uint)fVar138),auVar80);
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * auVar157._0_4_)),
                                              ZEXT416((uint)fVar138),auVar95);
                    fVar118 = 1.0 - local_218;
                    fVar138 = fVar118 * local_218 * local_218 * 3.0;
                    fVar134 = local_218 * local_218 * local_218;
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * auVar95._0_4_)),
                                              ZEXT416((uint)fVar138),auVar80);
                    fVar195 = local_218 * 3.0 * fVar118 * fVar118;
                    auVar79 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar195),auVar79);
                    fVar137 = fVar118 * fVar118 * fVar118;
                    auVar82 = vfmadd231ss_fma(auVar79,ZEXT416((uint)fVar137),auVar82);
                    fVar133 = auVar82._0_4_;
                    if (((fVar77 <= fVar133) &&
                        (fVar154 = *(float *)(ray + k * 4 + 0x80), fVar133 <= fVar154)) &&
                       (pGVar8 = (context->scene->geometries).items[uVar69].ptr,
                       (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar82 = vshufps_avx(auVar251,auVar251,0x55);
                      auVar269._8_4_ = 0x3f800000;
                      auVar269._0_8_ = &DAT_3f8000003f800000;
                      auVar269._12_4_ = 0x3f800000;
                      auVar79 = vsubps_avx(auVar269,auVar82);
                      fVar155 = auVar82._0_4_;
                      auVar281._0_4_ = fVar155 * (float)local_3e8._0_4_;
                      fVar156 = auVar82._4_4_;
                      auVar281._4_4_ = fVar156 * (float)local_3e8._4_4_;
                      fVar272 = auVar82._8_4_;
                      auVar281._8_4_ = fVar272 * fStack_3e0;
                      fVar197 = auVar82._12_4_;
                      auVar281._12_4_ = fVar197 * fStack_3dc;
                      auVar298._0_4_ = fVar155 * (float)local_3f8._0_4_;
                      auVar298._4_4_ = fVar156 * (float)local_3f8._4_4_;
                      auVar298._8_4_ = fVar272 * fStack_3f0;
                      auVar298._12_4_ = fVar197 * fStack_3ec;
                      local_4c8 = auVar22._0_4_;
                      fStack_4c4 = auVar22._4_4_;
                      fStack_4c0 = auVar22._8_4_;
                      fStack_4bc = auVar22._12_4_;
                      auVar307._0_4_ = fVar155 * local_4c8;
                      auVar307._4_4_ = fVar156 * fStack_4c4;
                      auVar307._8_4_ = fVar272 * fStack_4c0;
                      auVar307._12_4_ = fVar197 * fStack_4bc;
                      local_4d8 = auVar23._0_4_;
                      fStack_4d4 = auVar23._4_4_;
                      fStack_4d0 = auVar23._8_4_;
                      fStack_4cc = auVar23._12_4_;
                      auVar322._0_4_ = fVar155 * local_4d8;
                      auVar322._4_4_ = fVar156 * fStack_4d4;
                      auVar322._8_4_ = fVar272 * fStack_4d0;
                      auVar322._12_4_ = fVar197 * fStack_4cc;
                      auVar80 = vfmadd231ps_fma(auVar281,auVar79,local_3c8);
                      auVar95 = vfmadd231ps_fma(auVar298,auVar79,auVar21);
                      auVar101 = vfmadd231ps_fma(auVar307,auVar79,local_3d8);
                      auVar119 = vfmadd231ps_fma(auVar322,auVar79,auVar158);
                      auVar79 = vsubps_avx(auVar95,auVar80);
                      auVar80 = vsubps_avx(auVar101,auVar95);
                      auVar95 = vsubps_avx(auVar119,auVar101);
                      auVar323._0_4_ = local_218 * auVar80._0_4_;
                      auVar323._4_4_ = local_218 * auVar80._4_4_;
                      auVar323._8_4_ = local_218 * auVar80._8_4_;
                      auVar323._12_4_ = local_218 * auVar80._12_4_;
                      auVar258._4_4_ = fVar118;
                      auVar258._0_4_ = fVar118;
                      auVar258._8_4_ = fVar118;
                      auVar258._12_4_ = fVar118;
                      auVar79 = vfmadd231ps_fma(auVar323,auVar258,auVar79);
                      auVar282._0_4_ = local_218 * auVar95._0_4_;
                      auVar282._4_4_ = local_218 * auVar95._4_4_;
                      auVar282._8_4_ = local_218 * auVar95._8_4_;
                      auVar282._12_4_ = local_218 * auVar95._12_4_;
                      auVar80 = vfmadd231ps_fma(auVar282,auVar258,auVar80);
                      auVar283._0_4_ = local_218 * auVar80._0_4_;
                      auVar283._4_4_ = local_218 * auVar80._4_4_;
                      auVar283._8_4_ = local_218 * auVar80._8_4_;
                      auVar283._12_4_ = local_218 * auVar80._12_4_;
                      auVar80 = vfmadd231ps_fma(auVar283,auVar258,auVar79);
                      auVar236._0_4_ = fVar134 * (float)local_348._0_4_;
                      auVar236._4_4_ = fVar134 * (float)local_348._4_4_;
                      auVar236._8_4_ = fVar134 * fStack_340;
                      auVar236._12_4_ = fVar134 * fStack_33c;
                      auVar174._4_4_ = fVar138;
                      auVar174._0_4_ = fVar138;
                      auVar174._8_4_ = fVar138;
                      auVar174._12_4_ = fVar138;
                      auVar79 = vfmadd132ps_fma(auVar174,auVar236,local_338);
                      auVar211._4_4_ = fVar195;
                      auVar211._0_4_ = fVar195;
                      auVar211._8_4_ = fVar195;
                      auVar211._12_4_ = fVar195;
                      auVar79 = vfmadd132ps_fma(auVar211,auVar79,local_328);
                      auVar237._0_4_ = auVar80._0_4_ * 3.0;
                      auVar237._4_4_ = auVar80._4_4_ * 3.0;
                      auVar237._8_4_ = auVar80._8_4_ * 3.0;
                      auVar237._12_4_ = auVar80._12_4_ * 3.0;
                      auVar192._4_4_ = fVar137;
                      auVar192._0_4_ = fVar137;
                      auVar192._8_4_ = fVar137;
                      auVar192._12_4_ = fVar137;
                      auVar80 = vfmadd132ps_fma(auVar192,auVar79,local_318);
                      auVar79 = vshufps_avx(auVar237,auVar237,0xc9);
                      auVar175._0_4_ = auVar80._0_4_ * auVar79._0_4_;
                      auVar175._4_4_ = auVar80._4_4_ * auVar79._4_4_;
                      auVar175._8_4_ = auVar80._8_4_ * auVar79._8_4_;
                      auVar175._12_4_ = auVar80._12_4_ * auVar79._12_4_;
                      auVar79 = vshufps_avx(auVar80,auVar80,0xc9);
                      auVar79 = vfmsub231ps_fma(auVar175,auVar237,auVar79);
                      local_228 = auVar79._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar133;
                        uVar78 = vextractps_avx(auVar79,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar78;
                        uVar78 = vextractps_avx(auVar79,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar78;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar178;
                        *(uint *)(ray + k * 4 + 0x110) = uVar7;
                        *(uint *)(ray + k * 4 + 0x120) = uVar69;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar80 = vshufps_avx(auVar79,auVar79,0x55);
                        auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
                        local_248[0] = (RTCHitN)auVar80[0];
                        local_248[1] = (RTCHitN)auVar80[1];
                        local_248[2] = (RTCHitN)auVar80[2];
                        local_248[3] = (RTCHitN)auVar80[3];
                        local_248[4] = (RTCHitN)auVar80[4];
                        local_248[5] = (RTCHitN)auVar80[5];
                        local_248[6] = (RTCHitN)auVar80[6];
                        local_248[7] = (RTCHitN)auVar80[7];
                        local_248[8] = (RTCHitN)auVar80[8];
                        local_248[9] = (RTCHitN)auVar80[9];
                        local_248[10] = (RTCHitN)auVar80[10];
                        local_248[0xb] = (RTCHitN)auVar80[0xb];
                        local_248[0xc] = (RTCHitN)auVar80[0xc];
                        local_248[0xd] = (RTCHitN)auVar80[0xd];
                        local_248[0xe] = (RTCHitN)auVar80[0xe];
                        local_248[0xf] = (RTCHitN)auVar80[0xf];
                        local_238 = auVar79;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar82;
                        local_1f8 = CONCAT44(uStack_374,local_378);
                        uStack_1f0 = CONCAT44(uStack_36c,uStack_370);
                        local_1e8._4_4_ = uStack_364;
                        local_1e8._0_4_ = local_368;
                        local_1e8._8_4_ = uStack_360;
                        local_1e8._12_4_ = uStack_35c;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar133;
                        local_448 = *local_438;
                        uStack_440 = local_438[1];
                        local_428.valid = (int *)&local_448;
                        local_428.geometryUserPtr = pGVar8->userPtr;
                        local_428.context = context->user;
                        local_428.hit = local_248;
                        local_428.N = 4;
                        local_428.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->intersectionFilterN)(&local_428);
                          auVar117._8_56_ = extraout_var;
                          auVar117._0_8_ = extraout_XMM1_Qa;
                          auVar79 = auVar117._0_16_;
                        }
                        auVar59._8_8_ = uStack_440;
                        auVar59._0_8_ = local_448;
                        if (auVar59 == (undefined1  [16])0x0) {
                          auVar82 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                          auVar82 = auVar82 ^ auVar79;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          auVar79 = vpcmpeqd_avx(auVar82,auVar82);
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var14)(&local_428);
                            auVar79 = vpcmpeqd_avx(auVar79,auVar79);
                          }
                          auVar60._8_8_ = uStack_440;
                          auVar60._0_8_ = local_448;
                          auVar80 = vpcmpeqd_avx(auVar60,_DAT_01feba10);
                          auVar82 = auVar80 ^ auVar79;
                          if (auVar60 != (undefined1  [16])0x0) {
                            auVar80 = auVar80 ^ auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])local_428.hit);
                            *(undefined1 (*) [16])(local_428.ray + 0xc0) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x10));
                            *(undefined1 (*) [16])(local_428.ray + 0xd0) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x20));
                            *(undefined1 (*) [16])(local_428.ray + 0xe0) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x30));
                            *(undefined1 (*) [16])(local_428.ray + 0xf0) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x40));
                            *(undefined1 (*) [16])(local_428.ray + 0x100) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x50));
                            *(undefined1 (*) [16])(local_428.ray + 0x110) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x60));
                            *(undefined1 (*) [16])(local_428.ray + 0x120) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x70));
                            *(undefined1 (*) [16])(local_428.ray + 0x130) = auVar79;
                            auVar79 = vmaskmovps_avx(auVar80,*(undefined1 (*) [16])
                                                              (local_428.hit + 0x80));
                            *(undefined1 (*) [16])(local_428.ray + 0x140) = auVar79;
                          }
                        }
                        auVar114._8_8_ = 0x100000001;
                        auVar114._0_8_ = 0x100000001;
                        if ((auVar114 & auVar82) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar154;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar72 = lVar72 + -1;
            } while (lVar72 != 0);
          }
          else {
            bVar55 = false;
          }
        }
      }
    } while (bVar55);
    local_308 = vinsertps_avx(auVar81,ZEXT416((uint)fVar194),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }